

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  BBox1f BVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int iVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  uint uVar48;
  uint uVar49;
  long lVar50;
  byte bVar51;
  uint uVar52;
  undefined4 uVar53;
  undefined8 unaff_RBP;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar84;
  float fVar86;
  vint4 bi_2;
  undefined1 auVar61 [16];
  float fVar87;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar85;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar88;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined8 uVar89;
  vint4 bi_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 extraout_var [56];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  vint4 ai_2;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar135;
  float fVar146;
  vint4 ai;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  vint4 bi;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  float fVar162;
  float fVar180;
  float fVar181;
  vint4 ai_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar182;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  float fVar195;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar187 [16];
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar196;
  undefined1 auVar194 [32];
  float fVar200;
  float fVar210;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar211;
  float fVar227;
  vfloat4 a0_2;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar228;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  vfloat4 a0_3;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar249;
  float fVar261;
  float fVar262;
  vfloat4 a0_1;
  undefined1 auVar253 [16];
  undefined1 auVar250 [16];
  float fVar263;
  undefined1 auVar251 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar252 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  vfloat4 a0;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar289 [32];
  vfloat_impl<4> p00;
  undefined1 local_608 [8];
  undefined8 uStack_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined1 local_558 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_518 [16];
  undefined1 (*local_500) [16];
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 auStack_4e8 [16];
  undefined1 local_4d8 [32];
  RTCFilterFunctionNArguments args;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined4 local_418;
  undefined4 local_408;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  uint mask_stack [4];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar111 [64];
  undefined1 auVar288 [32];
  
  PVar4 = prim[1];
  uVar54 = (ulong)(byte)PVar4;
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar57 = *(float *)(prim + uVar54 * 0x19 + 0x12);
  auVar106 = vsubps_avx(auVar106,*(undefined1 (*) [16])(prim + uVar54 * 0x19 + 6));
  auVar61._0_4_ = fVar57 * auVar106._0_4_;
  auVar61._4_4_ = fVar57 * auVar106._4_4_;
  auVar61._8_4_ = fVar57 * auVar106._8_4_;
  auVar61._12_4_ = fVar57 * auVar106._12_4_;
  auVar147._0_4_ = fVar57 * auVar10._0_4_;
  auVar147._4_4_ = fVar57 * auVar10._4_4_;
  auVar147._8_4_ = fVar57 * auVar10._8_4_;
  auVar147._12_4_ = fVar57 * auVar10._12_4_;
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 4 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 6 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xb + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xc + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xd + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x12 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x13 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x14 + 6)));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar275._4_4_ = auVar147._0_4_;
  auVar275._0_4_ = auVar147._0_4_;
  auVar275._8_4_ = auVar147._0_4_;
  auVar275._12_4_ = auVar147._0_4_;
  auVar91 = vshufps_avx(auVar147,auVar147,0x55);
  auVar62 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar57 = auVar62._0_4_;
  auVar229._0_4_ = fVar57 * auVar13._0_4_;
  fVar84 = auVar62._4_4_;
  auVar229._4_4_ = fVar84 * auVar13._4_4_;
  fVar60 = auVar62._8_4_;
  auVar229._8_4_ = fVar60 * auVar13._8_4_;
  fVar87 = auVar62._12_4_;
  auVar229._12_4_ = fVar87 * auVar13._12_4_;
  auVar212._0_4_ = auVar16._0_4_ * fVar57;
  auVar212._4_4_ = auVar16._4_4_ * fVar84;
  auVar212._8_4_ = auVar16._8_4_ * fVar60;
  auVar212._12_4_ = auVar16._12_4_ * fVar87;
  auVar183._0_4_ = auVar112._0_4_ * fVar57;
  auVar183._4_4_ = auVar112._4_4_ * fVar84;
  auVar183._8_4_ = auVar112._8_4_ * fVar60;
  auVar183._12_4_ = auVar112._12_4_ * fVar87;
  auVar62 = vfmadd231ps_fma(auVar229,auVar91,auVar10);
  auVar92 = vfmadd231ps_fma(auVar212,auVar91,auVar15);
  auVar91 = vfmadd231ps_fma(auVar183,auVar63,auVar91);
  auVar123 = vfmadd231ps_fma(auVar62,auVar275,auVar106);
  auVar92 = vfmadd231ps_fma(auVar92,auVar275,auVar14);
  auVar137 = vfmadd231ps_fma(auVar91,auVar64,auVar275);
  auVar276._4_4_ = auVar61._0_4_;
  auVar276._0_4_ = auVar61._0_4_;
  auVar276._8_4_ = auVar61._0_4_;
  auVar276._12_4_ = auVar61._0_4_;
  auVar91 = vshufps_avx(auVar61,auVar61,0x55);
  auVar62 = vshufps_avx(auVar61,auVar61,0xaa);
  fVar57 = auVar62._0_4_;
  auVar148._0_4_ = fVar57 * auVar13._0_4_;
  fVar84 = auVar62._4_4_;
  auVar148._4_4_ = fVar84 * auVar13._4_4_;
  fVar60 = auVar62._8_4_;
  auVar148._8_4_ = fVar60 * auVar13._8_4_;
  fVar87 = auVar62._12_4_;
  auVar148._12_4_ = fVar87 * auVar13._12_4_;
  auVar90._0_4_ = auVar16._0_4_ * fVar57;
  auVar90._4_4_ = auVar16._4_4_ * fVar84;
  auVar90._8_4_ = auVar16._8_4_ * fVar60;
  auVar90._12_4_ = auVar16._12_4_ * fVar87;
  auVar62._0_4_ = auVar112._0_4_ * fVar57;
  auVar62._4_4_ = auVar112._4_4_ * fVar84;
  auVar62._8_4_ = auVar112._8_4_ * fVar60;
  auVar62._12_4_ = auVar112._12_4_ * fVar87;
  auVar10 = vfmadd231ps_fma(auVar148,auVar91,auVar10);
  auVar13 = vfmadd231ps_fma(auVar90,auVar91,auVar15);
  auVar15 = vfmadd231ps_fma(auVar62,auVar91,auVar63);
  auVar16 = vfmadd231ps_fma(auVar10,auVar276,auVar106);
  auVar63 = vfmadd231ps_fma(auVar13,auVar276,auVar14);
  auVar112 = vfmadd231ps_fma(auVar15,auVar276,auVar64);
  auVar243._8_4_ = 0x7fffffff;
  auVar243._0_8_ = 0x7fffffff7fffffff;
  auVar243._12_4_ = 0x7fffffff;
  auVar106 = vandps_avx(auVar123,auVar243);
  auVar136._8_4_ = 0x219392ef;
  auVar136._0_8_ = 0x219392ef219392ef;
  auVar136._12_4_ = 0x219392ef;
  auVar106 = vcmpps_avx(auVar106,auVar136,1);
  auVar10 = vblendvps_avx(auVar123,auVar136,auVar106);
  auVar106 = vandps_avx(auVar92,auVar243);
  auVar106 = vcmpps_avx(auVar106,auVar136,1);
  auVar13 = vblendvps_avx(auVar92,auVar136,auVar106);
  auVar106 = vandps_avx(auVar243,auVar137);
  auVar106 = vcmpps_avx(auVar106,auVar136,1);
  auVar106 = vblendvps_avx(auVar137,auVar136,auVar106);
  auVar14 = vrcpps_avx(auVar10);
  auVar184._8_4_ = 0x3f800000;
  auVar184._0_8_ = 0x3f8000003f800000;
  auVar184._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar14,auVar184);
  auVar14 = vfmadd132ps_fma(auVar10,auVar14,auVar14);
  auVar10 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar10,auVar184);
  auVar15 = vfmadd132ps_fma(auVar13,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar106);
  auVar106 = vfnmadd213ps_fma(auVar106,auVar10,auVar184);
  auVar64 = vfmadd132ps_fma(auVar106,auVar10,auVar10);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar54 * 7 + 6);
  auVar106 = vpmovsxwd_avx(auVar106);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar16);
  auVar137._0_4_ = auVar14._0_4_ * auVar106._0_4_;
  auVar137._4_4_ = auVar14._4_4_ * auVar106._4_4_;
  auVar137._8_4_ = auVar14._8_4_ * auVar106._8_4_;
  auVar137._12_4_ = auVar14._12_4_ * auVar106._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar54 * 9 + 6);
  auVar106 = vpmovsxwd_avx(auVar10);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar16);
  auVar149._0_4_ = auVar14._0_4_ * auVar106._0_4_;
  auVar149._4_4_ = auVar14._4_4_ * auVar106._4_4_;
  auVar149._8_4_ = auVar14._8_4_ * auVar106._8_4_;
  auVar149._12_4_ = auVar14._12_4_ * auVar106._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar54 * 0xe + 6);
  auVar106 = vpmovsxwd_avx(auVar13);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar63);
  auVar163._0_4_ = auVar15._0_4_ * auVar106._0_4_;
  auVar163._4_4_ = auVar15._4_4_ * auVar106._4_4_;
  auVar163._8_4_ = auVar15._8_4_ * auVar106._8_4_;
  auVar163._12_4_ = auVar15._12_4_ * auVar106._12_4_;
  auVar92._1_3_ = 0;
  auVar92[0] = PVar4;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar106 = vpmovsxwd_avx(auVar14);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar63);
  auVar91._0_4_ = auVar15._0_4_ * auVar106._0_4_;
  auVar91._4_4_ = auVar15._4_4_ * auVar106._4_4_;
  auVar91._8_4_ = auVar15._8_4_ * auVar106._8_4_;
  auVar91._12_4_ = auVar15._12_4_ * auVar106._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar54 * 0x15 + 6);
  auVar106 = vpmovsxwd_avx(auVar15);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar112);
  auVar123._0_4_ = auVar64._0_4_ * auVar106._0_4_;
  auVar123._4_4_ = auVar64._4_4_ * auVar106._4_4_;
  auVar123._8_4_ = auVar64._8_4_ * auVar106._8_4_;
  auVar123._12_4_ = auVar64._12_4_ * auVar106._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar54 * 0x17 + 6);
  auVar106 = vpmovsxwd_avx(auVar16);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar112);
  auVar63._0_4_ = auVar64._0_4_ * auVar106._0_4_;
  auVar63._4_4_ = auVar64._4_4_ * auVar106._4_4_;
  auVar63._8_4_ = auVar64._8_4_ * auVar106._8_4_;
  auVar63._12_4_ = auVar64._12_4_ * auVar106._12_4_;
  auVar106 = vpminsd_avx(auVar137,auVar149);
  auVar10 = vpminsd_avx(auVar163,auVar91);
  auVar106 = vmaxps_avx(auVar106,auVar10);
  auVar10 = vpminsd_avx(auVar123,auVar63);
  uVar53 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar213._4_4_ = uVar53;
  auVar213._0_4_ = uVar53;
  auVar213._8_4_ = uVar53;
  auVar213._12_4_ = uVar53;
  auVar10 = vmaxps_avx(auVar10,auVar213);
  auVar106 = vmaxps_avx(auVar106,auVar10);
  auVar201._0_4_ = auVar106._0_4_ * 0.99999964;
  auVar201._4_4_ = auVar106._4_4_ * 0.99999964;
  auVar201._8_4_ = auVar106._8_4_ * 0.99999964;
  auVar201._12_4_ = auVar106._12_4_ * 0.99999964;
  auVar106 = vpmaxsd_avx(auVar137,auVar149);
  auVar10 = vpmaxsd_avx(auVar163,auVar91);
  auVar106 = vminps_avx(auVar106,auVar10);
  auVar10 = vpmaxsd_avx(auVar123,auVar63);
  uVar53 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar112._4_4_ = uVar53;
  auVar112._0_4_ = uVar53;
  auVar112._8_4_ = uVar53;
  auVar112._12_4_ = uVar53;
  auVar10 = vminps_avx(auVar10,auVar112);
  auVar106 = vminps_avx(auVar106,auVar10);
  auVar64._0_4_ = auVar106._0_4_ * 1.0000004;
  auVar64._4_4_ = auVar106._4_4_ * 1.0000004;
  auVar64._8_4_ = auVar106._8_4_ * 1.0000004;
  auVar64._12_4_ = auVar106._12_4_ * 1.0000004;
  auVar92[4] = PVar4;
  auVar92._5_3_ = 0;
  auVar92[8] = PVar4;
  auVar92._9_3_ = 0;
  auVar92[0xc] = PVar4;
  auVar92._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar92,_DAT_01f4ad30);
  auVar106 = vcmpps_avx(auVar201,auVar64,2);
  auVar106 = vandps_avx(auVar106,auVar10);
  uVar53 = vmovmskps_avx(auVar106);
  uVar54 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar53);
  auVar81._16_16_ = mm_lookupmask_ps._240_16_;
  auVar81._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
  local_500 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_01184cd7:
  if (uVar54 == 0) {
    return;
  }
  lVar50 = 0;
  for (uVar56 = uVar54; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  uVar49 = *(uint *)(prim + 2);
  uVar5 = *(uint *)(prim + lVar50 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar49].ptr;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar5);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar16 = *(undefined1 (*) [16])(_Var9 + uVar56 * (long)pvVar8);
  auVar106 = *(undefined1 (*) [16])(_Var9 + (uVar56 + 1) * (long)pvVar8);
  auVar10 = *(undefined1 (*) [16])(_Var9 + (uVar56 + 2) * (long)pvVar8);
  pfVar1 = (float *)(_Var9 + (long)pvVar8 * (uVar56 + 3));
  fVar57 = *pfVar1;
  fVar84 = pfVar1[1];
  fVar60 = pfVar1[2];
  fVar87 = pfVar1[3];
  lVar50 = *(long *)&pGVar6[1].time_range.upper;
  auVar13 = *(undefined1 (*) [16])(lVar50 + (long)p_Var7 * uVar56);
  auVar14 = *(undefined1 (*) [16])(lVar50 + (long)p_Var7 * (uVar56 + 1));
  auVar15 = *(undefined1 (*) [16])(lVar50 + (long)p_Var7 * (uVar56 + 2));
  uVar54 = uVar54 - 1 & uVar54;
  pfVar1 = (float *)(lVar50 + (long)p_Var7 * (uVar56 + 3));
  fVar162 = *pfVar1;
  fVar180 = pfVar1[1];
  fVar181 = pfVar1[2];
  fVar182 = pfVar1[3];
  if (uVar54 != 0) {
    uVar55 = uVar54 - 1 & uVar54;
    for (uVar56 = uVar54; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    }
    if (uVar55 != 0) {
      for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar64 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar64 = vinsertps_avx(auVar64,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar283._8_4_ = 0x80000000;
  auVar283._0_8_ = 0x8000000080000000;
  auVar283._12_4_ = 0x80000000;
  auVar127._0_4_ = fVar162 * -0.0;
  auVar127._4_4_ = fVar180 * -0.0;
  auVar127._8_4_ = fVar181 * -0.0;
  auVar127._12_4_ = fVar182 * -0.0;
  auVar63 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar15,auVar127);
  auVar65._0_4_ = auVar14._0_4_ + auVar63._0_4_;
  auVar65._4_4_ = auVar14._4_4_ + auVar63._4_4_;
  auVar65._8_4_ = auVar14._8_4_ + auVar63._8_4_;
  auVar65._12_4_ = auVar14._12_4_ + auVar63._12_4_;
  auVar112 = vfmadd231ps_fma(auVar65,auVar13,auVar283);
  auVar93._12_4_ = 0;
  auVar93._0_12_ = ZEXT812(0);
  auVar93 = auVar93 << 0x20;
  auVar113._0_4_ = fVar162 * 0.0;
  auVar113._4_4_ = fVar180 * 0.0;
  auVar113._8_4_ = fVar181 * 0.0;
  auVar113._12_4_ = fVar182 * 0.0;
  auVar202._8_4_ = 0x3f000000;
  auVar202._0_8_ = 0x3f0000003f000000;
  auVar202._12_4_ = 0x3f000000;
  auVar63 = vfmadd231ps_fma(auVar113,auVar15,auVar202);
  auVar63 = vfmadd231ps_fma(auVar63,auVar14,auVar93);
  auVar92 = vfnmadd231ps_fma(auVar63,auVar13,auVar202);
  auVar277._0_4_ = fVar57 * -0.0;
  auVar277._4_4_ = fVar84 * -0.0;
  auVar277._8_4_ = fVar60 * -0.0;
  auVar277._12_4_ = fVar87 * -0.0;
  auVar63 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar10,auVar277);
  auVar264._0_4_ = auVar106._0_4_ + auVar63._0_4_;
  auVar264._4_4_ = auVar106._4_4_ + auVar63._4_4_;
  auVar264._8_4_ = auVar106._8_4_ + auVar63._8_4_;
  auVar264._12_4_ = auVar106._12_4_ + auVar63._12_4_;
  auVar63 = vfmadd231ps_fma(auVar264,auVar16,auVar283);
  auVar250._0_4_ = fVar57 * 0.0;
  auVar250._4_4_ = fVar84 * 0.0;
  auVar250._8_4_ = fVar60 * 0.0;
  auVar250._12_4_ = fVar87 * 0.0;
  auVar91 = vfmadd231ps_fma(auVar250,auVar10,auVar202);
  auVar91 = vfmadd231ps_fma(auVar91,auVar106,auVar93);
  auVar123 = vfnmadd231ps_fma(auVar91,auVar16,auVar202);
  auVar124._0_4_ = auVar15._0_4_ + auVar127._0_4_;
  auVar124._4_4_ = auVar15._4_4_ + auVar127._4_4_;
  auVar124._8_4_ = auVar15._8_4_ + auVar127._8_4_;
  auVar124._12_4_ = auVar15._12_4_ + auVar127._12_4_;
  auVar91 = vfmadd231ps_fma(auVar124,auVar14,auVar93);
  auVar91 = vfmadd231ps_fma(auVar91,auVar13,auVar283);
  auVar138._0_4_ = fVar162 * 0.5;
  auVar138._4_4_ = fVar180 * 0.5;
  auVar138._8_4_ = fVar181 * 0.5;
  auVar138._12_4_ = fVar182 * 0.5;
  auVar15 = vfmadd231ps_fma(auVar138,auVar93,auVar15);
  auVar14 = vfnmadd231ps_fma(auVar15,auVar202,auVar14);
  auVar62 = vfmadd231ps_fma(auVar14,auVar93,auVar13);
  auVar214._0_4_ = auVar277._0_4_ + auVar10._0_4_;
  auVar214._4_4_ = auVar277._4_4_ + auVar10._4_4_;
  auVar214._8_4_ = auVar277._8_4_ + auVar10._8_4_;
  auVar214._12_4_ = auVar277._12_4_ + auVar10._12_4_;
  auVar13 = vfmadd231ps_fma(auVar214,auVar106,auVar93);
  auVar15 = vfmadd231ps_fma(auVar13,auVar16,auVar283);
  auVar230._0_4_ = fVar57 * 0.5;
  auVar230._4_4_ = fVar84 * 0.5;
  auVar230._8_4_ = fVar60 * 0.5;
  auVar230._12_4_ = fVar87 * 0.5;
  auVar10 = vfmadd231ps_fma(auVar230,auVar93,auVar10);
  auVar106 = vfnmadd231ps_fma(auVar10,auVar202,auVar106);
  auVar16 = vfmadd231ps_fma(auVar106,auVar93,auVar16);
  auVar106 = vshufps_avx(auVar92,auVar92,0xc9);
  auVar10 = vshufps_avx(auVar63,auVar63,0xc9);
  fVar122 = auVar92._0_4_;
  auVar164._0_4_ = fVar122 * auVar10._0_4_;
  fVar85 = auVar92._4_4_;
  auVar164._4_4_ = fVar85 * auVar10._4_4_;
  fVar86 = auVar92._8_4_;
  auVar164._8_4_ = fVar86 * auVar10._8_4_;
  fVar59 = auVar92._12_4_;
  auVar164._12_4_ = fVar59 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar164,auVar106,auVar63);
  auVar13 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar123,auVar123,0xc9);
  auVar165._0_4_ = fVar122 * auVar10._0_4_;
  auVar165._4_4_ = fVar85 * auVar10._4_4_;
  auVar165._8_4_ = fVar86 * auVar10._8_4_;
  auVar165._12_4_ = fVar59 * auVar10._12_4_;
  auVar106 = vfmsub231ps_fma(auVar165,auVar106,auVar123);
  auVar14 = vshufps_avx(auVar106,auVar106,0xc9);
  auVar106 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar10 = vshufps_avx(auVar15,auVar15,0xc9);
  fVar58 = auVar62._0_4_;
  auVar150._0_4_ = fVar58 * auVar10._0_4_;
  fVar228 = auVar62._4_4_;
  auVar150._4_4_ = fVar228 * auVar10._4_4_;
  fVar135 = auVar62._8_4_;
  auVar150._8_4_ = fVar135 * auVar10._8_4_;
  fVar146 = auVar62._12_4_;
  auVar150._12_4_ = fVar146 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar150,auVar106,auVar15);
  auVar15 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar185._0_4_ = fVar58 * auVar10._0_4_;
  auVar185._4_4_ = fVar228 * auVar10._4_4_;
  auVar185._8_4_ = fVar135 * auVar10._8_4_;
  auVar185._12_4_ = fVar146 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar185,auVar106,auVar16);
  auVar106 = vdpps_avx(auVar13,auVar13,0x7f);
  auVar16 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar84 = auVar106._0_4_;
  auVar63 = ZEXT416((uint)fVar84);
  auVar10 = vrsqrtss_avx(auVar63,auVar63);
  fVar57 = auVar10._0_4_;
  auVar10 = vdpps_avx(auVar13,auVar14,0x7f);
  fVar57 = fVar57 * 1.5 + fVar84 * -0.5 * fVar57 * fVar57 * fVar57;
  fVar162 = auVar13._0_4_ * fVar57;
  fVar180 = auVar13._4_4_ * fVar57;
  fVar181 = auVar13._8_4_ * fVar57;
  fVar182 = auVar13._12_4_ * fVar57;
  auVar244._0_4_ = auVar14._0_4_ * fVar84;
  auVar244._4_4_ = auVar14._4_4_ * fVar84;
  auVar244._8_4_ = auVar14._8_4_ * fVar84;
  auVar244._12_4_ = auVar14._12_4_ * fVar84;
  fVar84 = auVar10._0_4_;
  auVar203._0_4_ = auVar13._0_4_ * fVar84;
  auVar203._4_4_ = auVar13._4_4_ * fVar84;
  auVar203._8_4_ = auVar13._8_4_ * fVar84;
  auVar203._12_4_ = auVar13._12_4_ * fVar84;
  auVar13 = vsubps_avx(auVar244,auVar203);
  auVar10 = vrcpss_avx(auVar63,auVar63);
  auVar106 = vfnmadd213ss_fma(auVar106,auVar10,SUB6416(ZEXT464(0x40000000),0));
  fVar60 = auVar10._0_4_ * auVar106._0_4_;
  auVar106 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar87 = auVar106._0_4_;
  auVar63 = ZEXT416((uint)fVar87);
  auVar10 = vrsqrtss_avx(auVar63,auVar63);
  fVar84 = auVar10._0_4_;
  fVar84 = fVar84 * 1.5 + fVar87 * -0.5 * fVar84 * fVar84 * fVar84;
  fVar249 = fVar84 * auVar15._0_4_;
  fVar261 = fVar84 * auVar15._4_4_;
  fVar262 = fVar84 * auVar15._8_4_;
  fVar263 = fVar84 * auVar15._12_4_;
  auVar10 = vdpps_avx(auVar15,auVar16,0x7f);
  auVar186._0_4_ = fVar87 * auVar16._0_4_;
  auVar186._4_4_ = fVar87 * auVar16._4_4_;
  auVar186._8_4_ = fVar87 * auVar16._8_4_;
  auVar186._12_4_ = fVar87 * auVar16._12_4_;
  fVar87 = auVar10._0_4_;
  auVar151._0_4_ = fVar87 * auVar15._0_4_;
  auVar151._4_4_ = fVar87 * auVar15._4_4_;
  auVar151._8_4_ = fVar87 * auVar15._8_4_;
  auVar151._12_4_ = fVar87 * auVar15._12_4_;
  auVar14 = vsubps_avx(auVar186,auVar151);
  auVar10 = vrcpss_avx(auVar63,auVar63);
  auVar106 = vfnmadd213ss_fma(auVar106,auVar10,SUB6416(ZEXT464(0x40000000),0));
  fVar87 = auVar106._0_4_ * auVar10._0_4_;
  auVar106 = vshufps_avx(auVar112,auVar112,0xff);
  auVar215._0_4_ = auVar106._0_4_ * fVar162;
  auVar215._4_4_ = auVar106._4_4_ * fVar180;
  auVar215._8_4_ = auVar106._8_4_ * fVar181;
  auVar215._12_4_ = auVar106._12_4_ * fVar182;
  auVar63 = vsubps_avx(auVar112,auVar215);
  auVar10 = vshufps_avx(auVar92,auVar92,0xff);
  auVar166._0_4_ = auVar10._0_4_ * fVar162 + fVar57 * auVar13._0_4_ * fVar60 * auVar106._0_4_;
  auVar166._4_4_ = auVar10._4_4_ * fVar180 + fVar57 * auVar13._4_4_ * fVar60 * auVar106._4_4_;
  auVar166._8_4_ = auVar10._8_4_ * fVar181 + fVar57 * auVar13._8_4_ * fVar60 * auVar106._8_4_;
  auVar166._12_4_ = auVar10._12_4_ * fVar182 + fVar57 * auVar13._12_4_ * fVar60 * auVar106._12_4_;
  auVar13 = vsubps_avx(auVar92,auVar166);
  auVar231._0_4_ = auVar215._0_4_ + auVar112._0_4_;
  auVar231._4_4_ = auVar215._4_4_ + auVar112._4_4_;
  auVar231._8_4_ = auVar215._8_4_ + auVar112._8_4_;
  auVar231._12_4_ = auVar215._12_4_ + auVar112._12_4_;
  auVar106 = vshufps_avx(auVar91,auVar91,0xff);
  auVar114._0_4_ = fVar249 * auVar106._0_4_;
  auVar114._4_4_ = fVar261 * auVar106._4_4_;
  auVar114._8_4_ = fVar262 * auVar106._8_4_;
  auVar114._12_4_ = fVar263 * auVar106._12_4_;
  auVar112 = vsubps_avx(auVar91,auVar114);
  auVar10 = vshufps_avx(auVar62,auVar62,0xff);
  auVar94._0_4_ = fVar249 * auVar10._0_4_ + auVar106._0_4_ * fVar84 * auVar14._0_4_ * fVar87;
  auVar94._4_4_ = fVar261 * auVar10._4_4_ + auVar106._4_4_ * fVar84 * auVar14._4_4_ * fVar87;
  auVar94._8_4_ = fVar262 * auVar10._8_4_ + auVar106._8_4_ * fVar84 * auVar14._8_4_ * fVar87;
  auVar94._12_4_ = fVar263 * auVar10._12_4_ + auVar106._12_4_ * fVar84 * auVar14._12_4_ * fVar87;
  auVar106 = vsubps_avx(auVar62,auVar94);
  fVar162 = auVar91._0_4_ + auVar114._0_4_;
  fVar180 = auVar91._4_4_ + auVar114._4_4_;
  fVar181 = auVar91._8_4_ + auVar114._8_4_;
  fVar182 = auVar91._12_4_ + auVar114._12_4_;
  auVar125._0_4_ = auVar63._0_4_ + auVar13._0_4_ * 0.33333334;
  auVar125._4_4_ = auVar63._4_4_ + auVar13._4_4_ * 0.33333334;
  auVar125._8_4_ = auVar63._8_4_ + auVar13._8_4_ * 0.33333334;
  auVar125._12_4_ = auVar63._12_4_ + auVar13._12_4_ * 0.33333334;
  auVar95._0_4_ = auVar106._0_4_ * 0.33333334;
  auVar95._4_4_ = auVar106._4_4_ * 0.33333334;
  auVar95._8_4_ = auVar106._8_4_ * 0.33333334;
  auVar95._12_4_ = auVar106._12_4_ * 0.33333334;
  auVar91 = vsubps_avx(auVar112,auVar95);
  auVar62 = vsubps_avx(auVar63,auVar64);
  auVar106 = vshufps_avx(auVar62,auVar62,0x55);
  auVar10 = vshufps_avx(auVar62,auVar62,0xaa);
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar57 = pre->ray_space[k].vz.field_0.m128[0];
  fVar84 = pre->ray_space[k].vz.field_0.m128[1];
  fVar60 = pre->ray_space[k].vz.field_0.m128[2];
  fVar87 = pre->ray_space[k].vz.field_0.m128[3];
  auVar245._0_4_ = fVar57 * auVar10._0_4_;
  auVar245._4_4_ = fVar84 * auVar10._4_4_;
  auVar245._8_4_ = fVar60 * auVar10._8_4_;
  auVar245._12_4_ = fVar87 * auVar10._12_4_;
  auVar13 = vfmadd231ps_fma(auVar245,(undefined1  [16])aVar3,auVar106);
  auVar92 = vsubps_avx(auVar125,auVar64);
  auVar106 = vshufps_avx(auVar92,auVar92,0x55);
  auVar10 = vshufps_avx(auVar92,auVar92,0xaa);
  auVar284._0_4_ = fVar57 * auVar10._0_4_;
  auVar284._4_4_ = fVar84 * auVar10._4_4_;
  auVar284._8_4_ = fVar60 * auVar10._8_4_;
  auVar284._12_4_ = fVar87 * auVar10._12_4_;
  auVar10 = vfmadd231ps_fma(auVar284,(undefined1  [16])aVar3,auVar106);
  auVar123 = vsubps_avx(auVar91,auVar64);
  auVar106 = vshufps_avx(auVar123,auVar123,0xaa);
  auVar251._0_4_ = fVar57 * auVar106._0_4_;
  auVar251._4_4_ = fVar84 * auVar106._4_4_;
  auVar251._8_4_ = fVar60 * auVar106._8_4_;
  auVar251._12_4_ = fVar87 * auVar106._12_4_;
  auVar106 = vshufps_avx(auVar123,auVar123,0x55);
  auVar14 = vfmadd231ps_fma(auVar251,(undefined1  [16])aVar3,auVar106);
  auVar137 = vsubps_avx(auVar112,auVar64);
  auVar106 = vshufps_avx(auVar137,auVar137,0xaa);
  auVar265._0_4_ = fVar57 * auVar106._0_4_;
  auVar265._4_4_ = fVar84 * auVar106._4_4_;
  auVar265._8_4_ = fVar60 * auVar106._8_4_;
  auVar265._12_4_ = fVar87 * auVar106._12_4_;
  auVar106 = vshufps_avx(auVar137,auVar137,0x55);
  auVar15 = vfmadd231ps_fma(auVar265,(undefined1  [16])aVar3,auVar106);
  auVar61 = vsubps_avx(auVar231,auVar64);
  auVar106 = vshufps_avx(auVar61,auVar61,0xaa);
  auVar152._0_4_ = fVar57 * auVar106._0_4_;
  auVar152._4_4_ = fVar84 * auVar106._4_4_;
  auVar152._8_4_ = fVar60 * auVar106._8_4_;
  auVar152._12_4_ = fVar87 * auVar106._12_4_;
  auVar106 = vshufps_avx(auVar61,auVar61,0x55);
  auVar16 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar3,auVar106);
  auVar66._0_4_ = (fVar122 + auVar166._0_4_) * 0.33333334 + auVar231._0_4_;
  auVar66._4_4_ = (fVar85 + auVar166._4_4_) * 0.33333334 + auVar231._4_4_;
  auVar66._8_4_ = (fVar86 + auVar166._8_4_) * 0.33333334 + auVar231._8_4_;
  auVar66._12_4_ = (fVar59 + auVar166._12_4_) * 0.33333334 + auVar231._12_4_;
  auVar90 = vsubps_avx(auVar66,auVar64);
  auVar106 = vshufps_avx(auVar90,auVar90,0xaa);
  auVar204._0_4_ = auVar106._0_4_ * fVar57;
  auVar204._4_4_ = auVar106._4_4_ * fVar84;
  auVar204._8_4_ = auVar106._8_4_ * fVar60;
  auVar204._12_4_ = auVar106._12_4_ * fVar87;
  auVar106 = vshufps_avx(auVar90,auVar90,0x55);
  auVar149 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar3,auVar106);
  auVar216._0_4_ = (fVar58 + auVar94._0_4_) * 0.33333334;
  auVar216._4_4_ = (fVar228 + auVar94._4_4_) * 0.33333334;
  auVar216._8_4_ = (fVar135 + auVar94._8_4_) * 0.33333334;
  auVar216._12_4_ = (fVar146 + auVar94._12_4_) * 0.33333334;
  auVar130._4_4_ = fVar180;
  auVar130._0_4_ = fVar162;
  auVar130._8_4_ = fVar181;
  auVar130._12_4_ = fVar182;
  auVar136 = vsubps_avx(auVar130,auVar216);
  auVar147 = vsubps_avx(auVar136,auVar64);
  auVar106 = vshufps_avx(auVar147,auVar147,0xaa);
  auVar217._0_4_ = auVar106._0_4_ * fVar57;
  auVar217._4_4_ = auVar106._4_4_ * fVar84;
  auVar217._8_4_ = auVar106._8_4_ * fVar60;
  auVar217._12_4_ = auVar106._12_4_ * fVar87;
  auVar106 = vshufps_avx(auVar147,auVar147,0x55);
  auVar163 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar3,auVar106);
  auVar148 = vsubps_avx(auVar130,auVar64);
  auVar106 = vshufps_avx(auVar148,auVar148,0xaa);
  auVar253._0_4_ = fVar57 * auVar106._0_4_;
  auVar253._4_4_ = fVar84 * auVar106._4_4_;
  auVar253._8_4_ = fVar60 * auVar106._8_4_;
  auVar253._12_4_ = fVar87 * auVar106._12_4_;
  auVar106 = vshufps_avx(auVar148,auVar148,0x55);
  auVar106 = vfmadd231ps_fma(auVar253,(undefined1  [16])aVar3,auVar106);
  local_408 = auVar62._0_4_;
  auVar167._4_4_ = local_408;
  auVar167._0_4_ = local_408;
  auVar167._8_4_ = local_408;
  auVar167._12_4_ = local_408;
  aVar3 = pre->ray_space[k].vx.field_0;
  auVar183 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar3,auVar167);
  local_418 = auVar92._0_4_;
  auVar168._4_4_ = local_418;
  auVar168._0_4_ = local_418;
  auVar168._8_4_ = local_418;
  auVar168._12_4_ = local_418;
  auVar184 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar3,auVar168);
  uVar53 = auVar123._0_4_;
  auVar169._4_4_ = uVar53;
  auVar169._0_4_ = uVar53;
  auVar169._8_4_ = uVar53;
  auVar169._12_4_ = uVar53;
  auVar212 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar3,auVar169);
  uVar53 = auVar137._0_4_;
  auVar170._4_4_ = uVar53;
  auVar170._0_4_ = uVar53;
  auVar170._8_4_ = uVar53;
  auVar170._12_4_ = uVar53;
  auVar213 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar3,auVar170);
  uVar53 = auVar61._0_4_;
  auVar171._4_4_ = uVar53;
  auVar171._0_4_ = uVar53;
  auVar171._8_4_ = uVar53;
  auVar171._12_4_ = uVar53;
  auVar229 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar3,auVar171);
  uVar53 = auVar90._0_4_;
  auVar172._4_4_ = uVar53;
  auVar172._0_4_ = uVar53;
  auVar172._8_4_ = uVar53;
  auVar172._12_4_ = uVar53;
  auVar275 = vfmadd231ps_fma(auVar149,(undefined1  [16])aVar3,auVar172);
  uVar53 = auVar147._0_4_;
  auVar173._4_4_ = uVar53;
  auVar173._0_4_ = uVar53;
  auVar173._8_4_ = uVar53;
  auVar173._12_4_ = uVar53;
  auVar276 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar3,auVar173);
  uVar53 = auVar148._0_4_;
  auVar174._4_4_ = uVar53;
  auVar174._0_4_ = uVar53;
  auVar174._8_4_ = uVar53;
  auVar174._12_4_ = uVar53;
  auVar93 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar3,auVar174);
  auVar14 = vmovlhps_avx(auVar183,auVar229);
  auVar15 = vmovlhps_avx(auVar184,auVar275);
  auVar16 = vmovlhps_avx(auVar212,auVar276);
  auVar64 = vmovlhps_avx(auVar213,auVar93);
  auVar106 = vminps_avx(auVar14,auVar15);
  auVar10 = vminps_avx(auVar16,auVar64);
  auVar13 = vminps_avx(auVar106,auVar10);
  auVar106 = vmaxps_avx(auVar14,auVar15);
  auVar10 = vmaxps_avx(auVar16,auVar64);
  auVar106 = vmaxps_avx(auVar106,auVar10);
  auVar10 = vshufpd_avx(auVar13,auVar13,3);
  auVar13 = vminps_avx(auVar13,auVar10);
  auVar10 = vshufpd_avx(auVar106,auVar106,3);
  auVar10 = vmaxps_avx(auVar106,auVar10);
  auVar106 = vandps_avx(auVar243,auVar13);
  auVar10 = vandps_avx(auVar243,auVar10);
  auVar106 = vmaxps_avx(auVar106,auVar10);
  auVar10 = vmovshdup_avx(auVar106);
  auVar106 = vmaxss_avx(auVar10,auVar106);
  fVar84 = auVar106._0_4_ * 9.536743e-07;
  auVar187._8_8_ = auVar183._0_8_;
  auVar187._0_8_ = auVar183._0_8_;
  auVar232._8_8_ = auVar184._0_8_;
  auVar232._0_8_ = auVar184._0_8_;
  auVar252._0_8_ = auVar212._0_8_;
  auVar252._8_8_ = auVar252._0_8_;
  auVar266._0_8_ = auVar213._0_8_;
  auVar266._8_8_ = auVar266._0_8_;
  local_78 = fVar84;
  fStack_74 = fVar84;
  fStack_70 = fVar84;
  fStack_6c = fVar84;
  fStack_68 = fVar84;
  fStack_64 = fVar84;
  fStack_60 = fVar84;
  fStack_5c = fVar84;
  fStack_90 = -fVar84;
  local_98 = -fVar84;
  fStack_94 = -fVar84;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  uVar56 = 0;
  fVar57 = *(float *)(ray + k * 4 + 0x30);
  auVar10 = vsubps_avx(auVar15,auVar14);
  auVar13 = vsubps_avx(auVar16,auVar15);
  auVar149 = vsubps_avx(auVar64,auVar16);
  auVar163 = vsubps_avx(auVar231,auVar63);
  auVar183 = vsubps_avx(auVar66,auVar125);
  auVar184 = vsubps_avx(auVar136,auVar91);
  auVar12._4_4_ = fVar180;
  auVar12._0_4_ = fVar162;
  auVar12._8_4_ = fVar181;
  auVar12._12_4_ = fVar182;
  auVar212 = vsubps_avx(auVar12,auVar112);
  auVar67 = ZEXT816(0x3f80000000000000);
  auVar106 = auVar67;
LAB_01185497:
  auVar213 = vshufps_avx(auVar67,auVar67,0x50);
  auVar285._8_4_ = 0x3f800000;
  auVar285._0_8_ = 0x3f8000003f800000;
  auVar285._12_4_ = 0x3f800000;
  auVar288._16_4_ = 0x3f800000;
  auVar288._0_16_ = auVar285;
  auVar288._20_4_ = 0x3f800000;
  auVar288._24_4_ = 0x3f800000;
  auVar288._28_4_ = 0x3f800000;
  auVar130 = vsubps_avx(auVar285,auVar213);
  fVar60 = auVar213._0_4_;
  fVar135 = auVar229._0_4_;
  auVar68._0_4_ = fVar135 * fVar60;
  fVar87 = auVar213._4_4_;
  fVar146 = auVar229._4_4_;
  auVar68._4_4_ = fVar146 * fVar87;
  fVar122 = auVar213._8_4_;
  auVar68._8_4_ = fVar135 * fVar122;
  fVar85 = auVar213._12_4_;
  auVar68._12_4_ = fVar146 * fVar85;
  fVar249 = auVar275._0_4_;
  auVar175._0_4_ = fVar249 * fVar60;
  fVar261 = auVar275._4_4_;
  auVar175._4_4_ = fVar261 * fVar87;
  auVar175._8_4_ = fVar249 * fVar122;
  auVar175._12_4_ = fVar261 * fVar85;
  fVar200 = auVar276._0_4_;
  auVar139._0_4_ = fVar200 * fVar60;
  fVar210 = auVar276._4_4_;
  auVar139._4_4_ = fVar210 * fVar87;
  auVar139._8_4_ = fVar200 * fVar122;
  auVar139._12_4_ = fVar210 * fVar85;
  fVar211 = auVar93._0_4_;
  auVar115._0_4_ = fVar211 * fVar60;
  fVar227 = auVar93._4_4_;
  auVar115._4_4_ = fVar227 * fVar87;
  auVar115._8_4_ = fVar211 * fVar122;
  auVar115._12_4_ = fVar227 * fVar85;
  auVar253 = vfmadd231ps_fma(auVar68,auVar130,auVar187);
  auVar94 = vfmadd231ps_fma(auVar175,auVar130,auVar232);
  auVar95 = vfmadd231ps_fma(auVar139,auVar130,auVar252);
  auVar245 = vfmadd231ps_fma(auVar115,auVar266,auVar130);
  auVar213 = vmovshdup_avx(auVar106);
  fVar60 = auVar106._0_4_;
  fStack_140 = (auVar213._0_4_ - fVar60) * 0.04761905;
  auVar225._4_4_ = fVar60;
  auVar225._0_4_ = fVar60;
  auVar225._8_4_ = fVar60;
  auVar225._12_4_ = fVar60;
  auVar225._16_4_ = fVar60;
  auVar225._20_4_ = fVar60;
  auVar225._24_4_ = fVar60;
  auVar225._28_4_ = fVar60;
  auVar107._0_8_ = auVar213._0_8_;
  auVar107._8_8_ = auVar107._0_8_;
  auVar107._16_8_ = auVar107._0_8_;
  auVar107._24_8_ = auVar107._0_8_;
  auVar81 = vsubps_avx(auVar107,auVar225);
  uVar53 = auVar253._0_4_;
  auVar281._4_4_ = uVar53;
  auVar281._0_4_ = uVar53;
  auVar281._8_4_ = uVar53;
  auVar281._12_4_ = uVar53;
  auVar281._16_4_ = uVar53;
  auVar281._20_4_ = uVar53;
  auVar281._24_4_ = uVar53;
  auVar281._28_4_ = uVar53;
  auVar213 = vmovshdup_avx(auVar253);
  uVar89 = auVar213._0_8_;
  auVar274._8_8_ = uVar89;
  auVar274._0_8_ = uVar89;
  auVar274._16_8_ = uVar89;
  auVar274._24_8_ = uVar89;
  fVar262 = auVar94._0_4_;
  auVar258._4_4_ = fVar262;
  auVar258._0_4_ = fVar262;
  auVar258._8_4_ = fVar262;
  auVar258._12_4_ = fVar262;
  auVar258._16_4_ = fVar262;
  auVar258._20_4_ = fVar262;
  auVar258._24_4_ = fVar262;
  auVar258._28_4_ = fVar262;
  auVar130 = vmovshdup_avx(auVar94);
  auVar108._0_8_ = auVar130._0_8_;
  auVar108._8_8_ = auVar108._0_8_;
  auVar108._16_8_ = auVar108._0_8_;
  auVar108._24_8_ = auVar108._0_8_;
  fVar228 = auVar95._0_4_;
  auVar192._4_4_ = fVar228;
  auVar192._0_4_ = fVar228;
  auVar192._8_4_ = fVar228;
  auVar192._12_4_ = fVar228;
  auVar192._16_4_ = fVar228;
  auVar192._20_4_ = fVar228;
  auVar192._24_4_ = fVar228;
  auVar192._28_4_ = fVar228;
  auVar12 = vmovshdup_avx(auVar95);
  auVar208._0_8_ = auVar12._0_8_;
  auVar208._8_8_ = auVar208._0_8_;
  auVar208._16_8_ = auVar208._0_8_;
  auVar208._24_8_ = auVar208._0_8_;
  fVar58 = auVar245._0_4_;
  auVar65 = vmovshdup_avx(auVar245);
  auVar113 = vfmadd132ps_fma(auVar81,auVar225,_DAT_01f7b040);
  auVar81 = vsubps_avx(auVar288,ZEXT1632(auVar113));
  fVar60 = auVar113._0_4_;
  fVar87 = auVar113._4_4_;
  auVar17._4_4_ = fVar262 * fVar87;
  auVar17._0_4_ = fVar262 * fVar60;
  fVar122 = auVar113._8_4_;
  auVar17._8_4_ = fVar262 * fVar122;
  fVar85 = auVar113._12_4_;
  auVar17._12_4_ = fVar262 * fVar85;
  auVar17._16_4_ = fVar262 * 0.0;
  auVar17._20_4_ = fVar262 * 0.0;
  auVar17._24_4_ = fVar262 * 0.0;
  auVar17._28_4_ = 0x3f800000;
  auVar113 = vfmadd231ps_fma(auVar17,auVar81,auVar281);
  fVar86 = auVar130._0_4_;
  fVar59 = auVar130._4_4_;
  auVar18._4_4_ = fVar59 * fVar87;
  auVar18._0_4_ = fVar86 * fVar60;
  auVar18._8_4_ = fVar86 * fVar122;
  auVar18._12_4_ = fVar59 * fVar85;
  auVar18._16_4_ = fVar86 * 0.0;
  auVar18._20_4_ = fVar59 * 0.0;
  auVar18._24_4_ = fVar86 * 0.0;
  auVar18._28_4_ = uVar53;
  auVar114 = vfmadd231ps_fma(auVar18,auVar81,auVar274);
  auVar19._4_4_ = fVar228 * fVar87;
  auVar19._0_4_ = fVar228 * fVar60;
  auVar19._8_4_ = fVar228 * fVar122;
  auVar19._12_4_ = fVar228 * fVar85;
  auVar19._16_4_ = fVar228 * 0.0;
  auVar19._20_4_ = fVar228 * 0.0;
  auVar19._24_4_ = fVar228 * 0.0;
  auVar19._28_4_ = auVar213._4_4_;
  auVar127 = vfmadd231ps_fma(auVar19,auVar81,auVar258);
  fVar86 = auVar12._0_4_;
  fVar59 = auVar12._4_4_;
  auVar11._4_4_ = fVar59 * fVar87;
  auVar11._0_4_ = fVar86 * fVar60;
  auVar11._8_4_ = fVar86 * fVar122;
  auVar11._12_4_ = fVar59 * fVar85;
  auVar11._16_4_ = fVar86 * 0.0;
  auVar11._20_4_ = fVar59 * 0.0;
  auVar11._24_4_ = fVar86 * 0.0;
  auVar11._28_4_ = fVar262;
  auVar124 = vfmadd231ps_fma(auVar11,auVar81,auVar108);
  auVar213 = vshufps_avx(auVar253,auVar253,0xaa);
  local_558._8_8_ = auVar213._0_8_;
  local_558._0_8_ = local_558._8_8_;
  local_558._16_8_ = local_558._8_8_;
  local_558._24_8_ = local_558._8_8_;
  auVar130 = vshufps_avx(auVar253,auVar253,0xff);
  uStack_600 = auVar130._0_8_;
  local_608 = (undefined1  [8])uStack_600;
  uStack_5f8 = uStack_600;
  uStack_5f0 = uStack_600;
  auVar20._4_4_ = fVar58 * fVar87;
  auVar20._0_4_ = fVar58 * fVar60;
  auVar20._8_4_ = fVar58 * fVar122;
  auVar20._12_4_ = fVar58 * fVar85;
  auVar20._16_4_ = fVar58 * 0.0;
  auVar20._20_4_ = fVar58 * 0.0;
  auVar20._24_4_ = fVar58 * 0.0;
  auVar20._28_4_ = fVar58;
  auVar253 = vfmadd231ps_fma(auVar20,auVar81,auVar192);
  auVar130 = vshufps_avx(auVar94,auVar94,0xaa);
  auVar193._0_8_ = auVar130._0_8_;
  auVar193._8_8_ = auVar193._0_8_;
  auVar193._16_8_ = auVar193._0_8_;
  auVar193._24_8_ = auVar193._0_8_;
  auVar12 = vshufps_avx(auVar94,auVar94,0xff);
  local_4d8._8_8_ = auVar12._0_8_;
  local_4d8._0_8_ = local_4d8._8_8_;
  local_4d8._16_8_ = local_4d8._8_8_;
  local_4d8._24_8_ = local_4d8._8_8_;
  fVar86 = auVar65._0_4_;
  fVar59 = auVar65._4_4_;
  auVar21._4_4_ = fVar59 * fVar87;
  auVar21._0_4_ = fVar86 * fVar60;
  auVar21._8_4_ = fVar86 * fVar122;
  auVar21._12_4_ = fVar59 * fVar85;
  auVar21._16_4_ = fVar86 * 0.0;
  auVar21._20_4_ = fVar59 * 0.0;
  auVar21._24_4_ = fVar86 * 0.0;
  auVar21._28_4_ = auVar213._4_4_;
  auVar138 = vfmadd231ps_fma(auVar21,auVar81,auVar208);
  auVar22._28_4_ = fVar59;
  auVar22._0_28_ =
       ZEXT1628(CONCAT412(auVar127._12_4_ * fVar85,
                          CONCAT48(auVar127._8_4_ * fVar122,
                                   CONCAT44(auVar127._4_4_ * fVar87,auVar127._0_4_ * fVar60))));
  auVar113 = vfmadd231ps_fma(auVar22,auVar81,ZEXT1632(auVar113));
  fVar86 = auVar12._4_4_;
  auVar260._28_4_ = fVar86;
  auVar260._0_28_ =
       ZEXT1628(CONCAT412(auVar124._12_4_ * fVar85,
                          CONCAT48(auVar124._8_4_ * fVar122,
                                   CONCAT44(auVar124._4_4_ * fVar87,auVar124._0_4_ * fVar60))));
  auVar114 = vfmadd231ps_fma(auVar260,auVar81,ZEXT1632(auVar114));
  auVar213 = vshufps_avx(auVar95,auVar95,0xaa);
  uVar89 = auVar213._0_8_;
  auVar179._8_8_ = uVar89;
  auVar179._0_8_ = uVar89;
  auVar179._16_8_ = uVar89;
  auVar179._24_8_ = uVar89;
  auVar65 = vshufps_avx(auVar95,auVar95,0xff);
  uVar89 = auVar65._0_8_;
  auVar289._8_8_ = uVar89;
  auVar289._0_8_ = uVar89;
  auVar289._16_8_ = uVar89;
  auVar289._24_8_ = uVar89;
  auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar253._12_4_ * fVar85,
                                               CONCAT48(auVar253._8_4_ * fVar122,
                                                        CONCAT44(auVar253._4_4_ * fVar87,
                                                                 auVar253._0_4_ * fVar60)))),auVar81
                            ,ZEXT1632(auVar127));
  auVar253 = vshufps_avx(auVar245,auVar245,0xaa);
  auVar94 = vshufps_avx(auVar245,auVar245,0xff);
  auVar245 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar138._12_4_,
                                                CONCAT48(fVar122 * auVar138._8_4_,
                                                         CONCAT44(fVar87 * auVar138._4_4_,
                                                                  fVar60 * auVar138._0_4_)))),
                             auVar81,ZEXT1632(auVar124));
  auVar127 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar95._12_4_,
                                                CONCAT48(fVar122 * auVar95._8_4_,
                                                         CONCAT44(fVar87 * auVar95._4_4_,
                                                                  fVar60 * auVar95._0_4_)))),auVar81
                             ,ZEXT1632(auVar113));
  auVar17 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar113));
  auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar245._12_4_,
                                               CONCAT48(fVar122 * auVar245._8_4_,
                                                        CONCAT44(fVar87 * auVar245._4_4_,
                                                                 fVar60 * auVar245._0_4_)))),auVar81
                            ,ZEXT1632(auVar114));
  auVar18 = vsubps_avx(ZEXT1632(auVar245),ZEXT1632(auVar114));
  fStack_3cc = auVar18._28_4_;
  auVar259._0_4_ = fStack_140 * auVar17._0_4_ * 3.0;
  auVar259._4_4_ = fStack_140 * auVar17._4_4_ * 3.0;
  auVar259._8_4_ = fStack_140 * auVar17._8_4_ * 3.0;
  auVar259._12_4_ = fStack_140 * auVar17._12_4_ * 3.0;
  auVar259._16_4_ = fStack_140 * auVar17._16_4_ * 3.0;
  auVar259._20_4_ = fStack_140 * auVar17._20_4_ * 3.0;
  auVar259._24_4_ = fStack_140 * auVar17._24_4_ * 3.0;
  auVar259._28_4_ = 0;
  local_3e8._0_4_ = fStack_140 * auVar18._0_4_ * 3.0;
  local_3e8._4_4_ = fStack_140 * auVar18._4_4_ * 3.0;
  fStack_3e0 = fStack_140 * auVar18._8_4_ * 3.0;
  fStack_3dc = fStack_140 * auVar18._12_4_ * 3.0;
  fStack_3d8 = fStack_140 * auVar18._16_4_ * 3.0;
  fStack_3d4 = fStack_140 * auVar18._20_4_ * 3.0;
  fStack_3d0 = fStack_140 * auVar18._24_4_ * 3.0;
  fVar59 = auVar130._0_4_;
  fVar58 = auVar130._4_4_;
  auVar24._4_4_ = fVar58 * fVar87;
  auVar24._0_4_ = fVar59 * fVar60;
  auVar24._8_4_ = fVar59 * fVar122;
  auVar24._12_4_ = fVar58 * fVar85;
  auVar24._16_4_ = fVar59 * 0.0;
  auVar24._20_4_ = fVar58 * 0.0;
  auVar24._24_4_ = fVar59 * 0.0;
  auVar24._28_4_ = fStack_3cc;
  auVar130 = vfmadd231ps_fma(auVar24,auVar81,local_558);
  fVar59 = auVar12._0_4_;
  auVar25._4_4_ = fVar86 * fVar87;
  auVar25._0_4_ = fVar59 * fVar60;
  auVar25._8_4_ = fVar59 * fVar122;
  auVar25._12_4_ = fVar86 * fVar85;
  auVar25._16_4_ = fVar59 * 0.0;
  auVar25._20_4_ = fVar86 * 0.0;
  auVar25._24_4_ = fVar59 * 0.0;
  auVar25._28_4_ = 0;
  auVar12 = vfmadd231ps_fma(auVar25,auVar81,_local_608);
  fVar86 = auVar213._0_4_;
  fVar59 = auVar213._4_4_;
  auVar26._4_4_ = fVar59 * fVar87;
  auVar26._0_4_ = fVar86 * fVar60;
  auVar26._8_4_ = fVar86 * fVar122;
  auVar26._12_4_ = fVar59 * fVar85;
  auVar26._16_4_ = fVar86 * 0.0;
  auVar26._20_4_ = fVar59 * 0.0;
  auVar26._24_4_ = fVar86 * 0.0;
  auVar26._28_4_ = auVar17._28_4_;
  auVar213 = vfmadd231ps_fma(auVar26,auVar81,auVar193);
  fVar86 = auVar65._0_4_;
  fVar228 = auVar65._4_4_;
  auVar27._4_4_ = fVar228 * fVar87;
  auVar27._0_4_ = fVar86 * fVar60;
  auVar27._8_4_ = fVar86 * fVar122;
  auVar27._12_4_ = fVar228 * fVar85;
  auVar27._16_4_ = fVar86 * 0.0;
  auVar27._20_4_ = fVar228 * 0.0;
  auVar27._24_4_ = fVar86 * 0.0;
  auVar27._28_4_ = fVar58;
  auVar65 = vfmadd231ps_fma(auVar27,auVar81,local_4d8);
  local_4d8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar127));
  fVar86 = auVar253._0_4_;
  fVar59 = auVar253._4_4_;
  auVar28._4_4_ = fVar59 * fVar87;
  auVar28._0_4_ = fVar86 * fVar60;
  auVar28._8_4_ = fVar86 * fVar122;
  auVar28._12_4_ = fVar59 * fVar85;
  auVar28._16_4_ = fVar86 * 0.0;
  auVar28._20_4_ = fVar59 * 0.0;
  auVar28._24_4_ = fVar86 * 0.0;
  auVar28._28_4_ = fVar59;
  auVar253 = vfmadd231ps_fma(auVar28,auVar81,auVar179);
  auVar20 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar95));
  fVar86 = auVar94._0_4_;
  fVar59 = auVar94._4_4_;
  auVar29._4_4_ = fVar59 * fVar87;
  auVar29._0_4_ = fVar86 * fVar60;
  auVar29._8_4_ = fVar86 * fVar122;
  auVar29._12_4_ = fVar59 * fVar85;
  auVar29._16_4_ = fVar86 * 0.0;
  auVar29._20_4_ = fVar59 * 0.0;
  auVar29._24_4_ = fVar86 * 0.0;
  auVar29._28_4_ = fVar59;
  auVar94 = vfmadd231ps_fma(auVar29,auVar81,auVar289);
  auVar30._28_4_ = fVar228;
  auVar30._0_28_ =
       ZEXT1628(CONCAT412(auVar213._12_4_ * fVar85,
                          CONCAT48(auVar213._8_4_ * fVar122,
                                   CONCAT44(auVar213._4_4_ * fVar87,auVar213._0_4_ * fVar60))));
  auVar130 = vfmadd231ps_fma(auVar30,auVar81,ZEXT1632(auVar130));
  auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar65._12_4_,
                                               CONCAT48(fVar122 * auVar65._8_4_,
                                                        CONCAT44(fVar87 * auVar65._4_4_,
                                                                 fVar60 * auVar65._0_4_)))),auVar81,
                            ZEXT1632(auVar12));
  auVar109._0_4_ = auVar127._0_4_ + auVar259._0_4_;
  auVar109._4_4_ = auVar127._4_4_ + auVar259._4_4_;
  auVar109._8_4_ = auVar127._8_4_ + auVar259._8_4_;
  auVar109._12_4_ = auVar127._12_4_ + auVar259._12_4_;
  auVar109._16_4_ = auVar259._16_4_ + 0.0;
  auVar109._20_4_ = auVar259._20_4_ + 0.0;
  auVar109._24_4_ = auVar259._24_4_ + 0.0;
  auVar109._28_4_ = 0;
  auVar213 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar253._12_4_ * fVar85,
                                                CONCAT48(auVar253._8_4_ * fVar122,
                                                         CONCAT44(auVar253._4_4_ * fVar87,
                                                                  auVar253._0_4_ * fVar60)))),
                             auVar81,ZEXT1632(auVar213));
  auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * fVar85,
                                               CONCAT48(auVar94._8_4_ * fVar122,
                                                        CONCAT44(auVar94._4_4_ * fVar87,
                                                                 auVar94._0_4_ * fVar60)))),auVar81,
                            ZEXT1632(auVar65));
  auVar253 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar213._12_4_,
                                                CONCAT48(fVar122 * auVar213._8_4_,
                                                         CONCAT44(fVar87 * auVar213._4_4_,
                                                                  fVar60 * auVar213._0_4_)))),
                             auVar81,ZEXT1632(auVar130));
  auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar65._12_4_ * fVar85,
                                               CONCAT48(auVar65._8_4_ * fVar122,
                                                        CONCAT44(auVar65._4_4_ * fVar87,
                                                                 auVar65._0_4_ * fVar60)))),
                            ZEXT1632(auVar12),auVar81);
  auVar81 = vsubps_avx(ZEXT1632(auVar213),ZEXT1632(auVar130));
  auVar17 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar12));
  auVar282._0_4_ = fStack_140 * auVar81._0_4_ * 3.0;
  auVar282._4_4_ = fStack_140 * auVar81._4_4_ * 3.0;
  auVar282._8_4_ = fStack_140 * auVar81._8_4_ * 3.0;
  auVar282._12_4_ = fStack_140 * auVar81._12_4_ * 3.0;
  auVar282._16_4_ = fStack_140 * auVar81._16_4_ * 3.0;
  auVar282._20_4_ = fStack_140 * auVar81._20_4_ * 3.0;
  auVar282._24_4_ = fStack_140 * auVar81._24_4_ * 3.0;
  auVar282._28_4_ = 0;
  local_158 = fStack_140 * auVar17._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar17._4_4_ * 3.0;
  auVar31._4_4_ = fStack_154;
  auVar31._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar17._8_4_ * 3.0;
  auVar31._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar17._12_4_ * 3.0;
  auVar31._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar17._16_4_ * 3.0;
  auVar31._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar17._20_4_ * 3.0;
  auVar31._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar17._24_4_ * 3.0;
  auVar31._24_4_ = fStack_140;
  auVar31._28_4_ = 0x40400000;
  _local_4f8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar253));
  auVar21 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar94));
  auVar81 = vsubps_avx(ZEXT1632(auVar253),ZEXT1632(auVar127));
  auVar17 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar95));
  auVar18 = vsubps_avx(_local_4f8,local_4d8);
  fVar262 = auVar81._0_4_ + auVar18._0_4_;
  fVar263 = auVar81._4_4_ + auVar18._4_4_;
  fVar195 = auVar81._8_4_ + auVar18._8_4_;
  fVar196 = auVar81._12_4_ + auVar18._12_4_;
  fVar197 = auVar81._16_4_ + auVar18._16_4_;
  fVar198 = auVar81._20_4_ + auVar18._20_4_;
  fVar199 = auVar81._24_4_ + auVar18._24_4_;
  auVar19 = vsubps_avx(auVar21,auVar20);
  auVar82._0_4_ = auVar17._0_4_ + auVar19._0_4_;
  auVar82._4_4_ = auVar17._4_4_ + auVar19._4_4_;
  auVar82._8_4_ = auVar17._8_4_ + auVar19._8_4_;
  auVar82._12_4_ = auVar17._12_4_ + auVar19._12_4_;
  auVar82._16_4_ = auVar17._16_4_ + auVar19._16_4_;
  auVar82._20_4_ = auVar17._20_4_ + auVar19._20_4_;
  auVar82._24_4_ = auVar17._24_4_ + auVar19._24_4_;
  auVar82._28_4_ = auVar17._28_4_ + auVar19._28_4_;
  local_f8 = ZEXT1632(auVar95);
  fVar60 = auVar95._0_4_;
  local_178 = (float)local_3e8._0_4_ + fVar60;
  fVar87 = auVar95._4_4_;
  fStack_174 = (float)local_3e8._4_4_ + fVar87;
  fVar122 = auVar95._8_4_;
  fStack_170 = fStack_3e0 + fVar122;
  fVar85 = auVar95._12_4_;
  fStack_16c = fStack_3dc + fVar85;
  fStack_168 = fStack_3d8 + 0.0;
  fStack_164 = fStack_3d4 + 0.0;
  fStack_160 = fStack_3d0 + 0.0;
  local_b8 = ZEXT1632(auVar127);
  auVar17 = vsubps_avx(local_b8,auVar259);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar17);
  auVar17 = vsubps_avx(local_f8,_local_3e8);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar17);
  local_118._0_4_ = auVar253._0_4_ + auVar282._0_4_;
  local_118._4_4_ = auVar253._4_4_ + auVar282._4_4_;
  local_118._8_4_ = auVar253._8_4_ + auVar282._8_4_;
  local_118._12_4_ = auVar253._12_4_ + auVar282._12_4_;
  local_118._16_4_ = auVar282._16_4_ + 0.0;
  local_118._20_4_ = auVar282._20_4_ + 0.0;
  local_118._24_4_ = auVar282._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar260 = ZEXT1632(auVar253);
  auVar17 = vsubps_avx(auVar260,auVar282);
  auVar22 = vpermps_avx2(_DAT_01fb7720,auVar17);
  fVar86 = auVar94._0_4_;
  local_158 = fVar86 + local_158;
  fVar59 = auVar94._4_4_;
  fStack_154 = fVar59 + fStack_154;
  fVar58 = auVar94._8_4_;
  fStack_150 = fVar58 + fStack_150;
  fVar228 = auVar94._12_4_;
  fStack_14c = fVar228 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar17 = vsubps_avx(ZEXT1632(auVar94),auVar31);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar17);
  auVar32._4_4_ = fVar87 * fVar263;
  auVar32._0_4_ = fVar60 * fVar262;
  auVar32._8_4_ = fVar122 * fVar195;
  auVar32._12_4_ = fVar85 * fVar196;
  auVar32._16_4_ = fVar197 * 0.0;
  auVar32._20_4_ = fVar198 * 0.0;
  auVar32._24_4_ = fVar199 * 0.0;
  auVar32._28_4_ = auVar17._28_4_;
  auVar213 = vfnmadd231ps_fma(auVar32,local_b8,auVar82);
  fStack_15c = fStack_3cc + 0.0;
  auVar33._4_4_ = fStack_174 * fVar263;
  auVar33._0_4_ = local_178 * fVar262;
  auVar33._8_4_ = fStack_170 * fVar195;
  auVar33._12_4_ = fStack_16c * fVar196;
  auVar33._16_4_ = fStack_168 * fVar197;
  auVar33._20_4_ = fStack_164 * fVar198;
  auVar33._24_4_ = fStack_160 * fVar199;
  auVar33._28_4_ = 0;
  auVar130 = vfnmadd231ps_fma(auVar33,auVar82,auVar109);
  auVar34._4_4_ = local_198._4_4_ * fVar263;
  auVar34._0_4_ = local_198._0_4_ * fVar262;
  auVar34._8_4_ = local_198._8_4_ * fVar195;
  auVar34._12_4_ = local_198._12_4_ * fVar196;
  auVar34._16_4_ = local_198._16_4_ * fVar197;
  auVar34._20_4_ = local_198._20_4_ * fVar198;
  auVar34._24_4_ = local_198._24_4_ * fVar199;
  auVar34._28_4_ = fStack_3cc + 0.0;
  auVar12 = vfnmadd231ps_fma(auVar34,local_d8,auVar82);
  local_608._0_4_ = auVar20._0_4_;
  local_608._4_4_ = auVar20._4_4_;
  uStack_600._0_4_ = auVar20._8_4_;
  uStack_600._4_4_ = auVar20._12_4_;
  uStack_5f8._0_4_ = auVar20._16_4_;
  uStack_5f8._4_4_ = auVar20._20_4_;
  uStack_5f0._0_4_ = auVar20._24_4_;
  uStack_5f0._4_4_ = auVar20._28_4_;
  auVar35._4_4_ = (float)local_608._4_4_ * fVar263;
  auVar35._0_4_ = (float)local_608._0_4_ * fVar262;
  auVar35._8_4_ = (float)uStack_600 * fVar195;
  auVar35._12_4_ = uStack_600._4_4_ * fVar196;
  auVar35._16_4_ = (float)uStack_5f8 * fVar197;
  auVar35._20_4_ = uStack_5f8._4_4_ * fVar198;
  auVar35._24_4_ = (float)uStack_5f0 * fVar199;
  auVar35._28_4_ = uStack_5f0._4_4_;
  auVar65 = vfnmadd231ps_fma(auVar35,local_4d8,auVar82);
  auVar209._0_4_ = fVar86 * fVar262;
  auVar209._4_4_ = fVar59 * fVar263;
  auVar209._8_4_ = fVar58 * fVar195;
  auVar209._12_4_ = fVar228 * fVar196;
  auVar209._16_4_ = fVar197 * 0.0;
  auVar209._20_4_ = fVar198 * 0.0;
  auVar209._24_4_ = fVar199 * 0.0;
  auVar209._28_4_ = 0;
  auVar253 = vfnmadd231ps_fma(auVar209,auVar260,auVar82);
  uStack_13c = 0x40400000;
  auVar36._4_4_ = fStack_154 * fVar263;
  auVar36._0_4_ = local_158 * fVar262;
  auVar36._8_4_ = fStack_150 * fVar195;
  auVar36._12_4_ = fStack_14c * fVar196;
  auVar36._16_4_ = fStack_148 * fVar197;
  auVar36._20_4_ = fStack_144 * fVar198;
  auVar36._24_4_ = fStack_140 * fVar199;
  auVar36._28_4_ = local_4d8._28_4_;
  auVar95 = vfnmadd231ps_fma(auVar36,local_118,auVar82);
  auVar37._4_4_ = local_138._4_4_ * fVar263;
  auVar37._0_4_ = local_138._0_4_ * fVar262;
  auVar37._8_4_ = local_138._8_4_ * fVar195;
  auVar37._12_4_ = local_138._12_4_ * fVar196;
  auVar37._16_4_ = local_138._16_4_ * fVar197;
  auVar37._20_4_ = local_138._20_4_ * fVar198;
  auVar37._24_4_ = local_138._24_4_ * fVar199;
  auVar37._28_4_ = local_138._28_4_;
  auVar245 = vfnmadd231ps_fma(auVar37,auVar22,auVar82);
  auVar38._4_4_ = auVar21._4_4_ * fVar263;
  auVar38._0_4_ = auVar21._0_4_ * fVar262;
  auVar38._8_4_ = auVar21._8_4_ * fVar195;
  auVar38._12_4_ = auVar21._12_4_ * fVar196;
  auVar38._16_4_ = auVar21._16_4_ * fVar197;
  auVar38._20_4_ = auVar21._20_4_ * fVar198;
  auVar38._24_4_ = auVar21._24_4_ * fVar199;
  auVar38._28_4_ = auVar81._28_4_ + auVar18._28_4_;
  auVar226 = ZEXT3264(_local_4f8);
  auVar113 = vfnmadd231ps_fma(auVar38,_local_4f8,auVar82);
  auVar17 = vminps_avx(ZEXT1632(auVar213),ZEXT1632(auVar130));
  auVar81 = vmaxps_avx(ZEXT1632(auVar213),ZEXT1632(auVar130));
  auVar18 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar65));
  auVar18 = vminps_avx(auVar17,auVar18);
  auVar17 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar65));
  auVar81 = vmaxps_avx(auVar81,auVar17);
  auVar19 = vminps_avx(ZEXT1632(auVar253),ZEXT1632(auVar95));
  auVar17 = vmaxps_avx(ZEXT1632(auVar253),ZEXT1632(auVar95));
  auVar11 = vminps_avx(ZEXT1632(auVar245),ZEXT1632(auVar113));
  auVar19 = vminps_avx(auVar19,auVar11);
  auVar19 = vminps_avx(auVar18,auVar19);
  auVar18 = vmaxps_avx(ZEXT1632(auVar245),ZEXT1632(auVar113));
  auVar17 = vmaxps_avx(auVar17,auVar18);
  auVar17 = vmaxps_avx(auVar81,auVar17);
  auVar47._4_4_ = fStack_74;
  auVar47._0_4_ = local_78;
  auVar47._8_4_ = fStack_70;
  auVar47._12_4_ = fStack_6c;
  auVar47._16_4_ = fStack_68;
  auVar47._20_4_ = fStack_64;
  auVar47._24_4_ = fStack_60;
  auVar47._28_4_ = fStack_5c;
  auVar81 = vcmpps_avx(auVar19,auVar47,2);
  auVar46._4_4_ = fStack_94;
  auVar46._0_4_ = local_98;
  auVar46._8_4_ = fStack_90;
  auVar46._12_4_ = fStack_8c;
  auVar46._16_4_ = fStack_88;
  auVar46._20_4_ = fStack_84;
  auVar46._24_4_ = fStack_80;
  auVar46._28_4_ = fStack_7c;
  auVar17 = vcmpps_avx(auVar17,auVar46,5);
  auVar81 = vandps_avx(auVar17,auVar81);
  auVar17 = local_1b8 & auVar81;
  if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0x7f,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar17 >> 0xbf,0) != '\0') ||
      (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0') {
    auVar17 = vsubps_avx(local_4d8,local_b8);
    auVar18 = vsubps_avx(_local_4f8,auVar260);
    fVar263 = auVar17._0_4_ + auVar18._0_4_;
    fVar195 = auVar17._4_4_ + auVar18._4_4_;
    fVar196 = auVar17._8_4_ + auVar18._8_4_;
    fVar197 = auVar17._12_4_ + auVar18._12_4_;
    fVar198 = auVar17._16_4_ + auVar18._16_4_;
    fVar199 = auVar17._20_4_ + auVar18._20_4_;
    fVar88 = auVar17._24_4_ + auVar18._24_4_;
    auVar19 = vsubps_avx(auVar20,local_f8);
    auVar11 = vsubps_avx(auVar21,ZEXT1632(auVar94));
    auVar110._0_4_ = auVar19._0_4_ + auVar11._0_4_;
    auVar110._4_4_ = auVar19._4_4_ + auVar11._4_4_;
    auVar110._8_4_ = auVar19._8_4_ + auVar11._8_4_;
    auVar110._12_4_ = auVar19._12_4_ + auVar11._12_4_;
    auVar110._16_4_ = auVar19._16_4_ + auVar11._16_4_;
    auVar110._20_4_ = auVar19._20_4_ + auVar11._20_4_;
    auVar110._24_4_ = auVar19._24_4_ + auVar11._24_4_;
    fVar262 = auVar11._28_4_;
    auVar110._28_4_ = auVar19._28_4_ + fVar262;
    auVar39._4_4_ = fVar87 * fVar195;
    auVar39._0_4_ = fVar60 * fVar263;
    auVar39._8_4_ = fVar122 * fVar196;
    auVar39._12_4_ = fVar85 * fVar197;
    auVar39._16_4_ = fVar198 * 0.0;
    auVar39._20_4_ = fVar199 * 0.0;
    auVar39._24_4_ = fVar88 * 0.0;
    auVar39._28_4_ = auVar21._28_4_;
    auVar253 = vfnmadd231ps_fma(auVar39,auVar110,local_b8);
    auVar40._4_4_ = fVar195 * fStack_174;
    auVar40._0_4_ = fVar263 * local_178;
    auVar40._8_4_ = fVar196 * fStack_170;
    auVar40._12_4_ = fVar197 * fStack_16c;
    auVar40._16_4_ = fVar198 * fStack_168;
    auVar40._20_4_ = fVar199 * fStack_164;
    auVar40._24_4_ = fVar88 * fStack_160;
    auVar40._28_4_ = 0;
    auVar213 = vfnmadd213ps_fma(auVar109,auVar110,auVar40);
    auVar41._4_4_ = fVar195 * local_198._4_4_;
    auVar41._0_4_ = fVar263 * local_198._0_4_;
    auVar41._8_4_ = fVar196 * local_198._8_4_;
    auVar41._12_4_ = fVar197 * local_198._12_4_;
    auVar41._16_4_ = fVar198 * local_198._16_4_;
    auVar41._20_4_ = fVar199 * local_198._20_4_;
    auVar41._24_4_ = fVar88 * local_198._24_4_;
    auVar41._28_4_ = 0;
    auVar130 = vfnmadd213ps_fma(local_d8,auVar110,auVar41);
    auVar42._4_4_ = (float)local_608._4_4_ * fVar195;
    auVar42._0_4_ = (float)local_608._0_4_ * fVar263;
    auVar42._8_4_ = (float)uStack_600 * fVar196;
    auVar42._12_4_ = uStack_600._4_4_ * fVar197;
    auVar42._16_4_ = (float)uStack_5f8 * fVar198;
    auVar42._20_4_ = uStack_5f8._4_4_ * fVar199;
    auVar42._24_4_ = (float)uStack_5f0 * fVar88;
    auVar42._28_4_ = 0;
    auVar94 = vfnmadd231ps_fma(auVar42,auVar110,local_4d8);
    auVar133._0_4_ = fVar86 * fVar263;
    auVar133._4_4_ = fVar59 * fVar195;
    auVar133._8_4_ = fVar58 * fVar196;
    auVar133._12_4_ = fVar228 * fVar197;
    auVar133._16_4_ = fVar198 * 0.0;
    auVar133._20_4_ = fVar199 * 0.0;
    auVar133._24_4_ = fVar88 * 0.0;
    auVar133._28_4_ = 0;
    auVar95 = vfnmadd231ps_fma(auVar133,auVar110,auVar260);
    auVar43._4_4_ = fVar195 * fStack_154;
    auVar43._0_4_ = fVar263 * local_158;
    auVar43._8_4_ = fVar196 * fStack_150;
    auVar43._12_4_ = fVar197 * fStack_14c;
    auVar43._16_4_ = fVar198 * fStack_148;
    auVar43._20_4_ = fVar199 * fStack_144;
    auVar43._24_4_ = fVar88 * fStack_140;
    auVar43._28_4_ = fVar262;
    auVar12 = vfnmadd213ps_fma(local_118,auVar110,auVar43);
    auVar44._4_4_ = fVar195 * local_138._4_4_;
    auVar44._0_4_ = fVar263 * local_138._0_4_;
    auVar44._8_4_ = fVar196 * local_138._8_4_;
    auVar44._12_4_ = fVar197 * local_138._12_4_;
    auVar44._16_4_ = fVar198 * local_138._16_4_;
    auVar44._20_4_ = fVar199 * local_138._20_4_;
    auVar44._24_4_ = fVar88 * local_138._24_4_;
    auVar44._28_4_ = fVar262;
    auVar65 = vfnmadd213ps_fma(auVar22,auVar110,auVar44);
    auVar226 = ZEXT1664(auVar65);
    auVar45._4_4_ = fVar195 * auVar21._4_4_;
    auVar45._0_4_ = fVar263 * auVar21._0_4_;
    auVar45._8_4_ = fVar196 * auVar21._8_4_;
    auVar45._12_4_ = fVar197 * auVar21._12_4_;
    auVar45._16_4_ = fVar198 * auVar21._16_4_;
    auVar45._20_4_ = fVar199 * auVar21._20_4_;
    auVar45._24_4_ = fVar88 * auVar21._24_4_;
    auVar45._28_4_ = auVar17._28_4_ + auVar18._28_4_;
    auVar245 = vfnmadd231ps_fma(auVar45,auVar110,_local_4f8);
    auVar18 = vminps_avx(ZEXT1632(auVar253),ZEXT1632(auVar213));
    auVar17 = vmaxps_avx(ZEXT1632(auVar253),ZEXT1632(auVar213));
    auVar19 = vminps_avx(ZEXT1632(auVar130),ZEXT1632(auVar94));
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(ZEXT1632(auVar130),ZEXT1632(auVar94));
    auVar17 = vmaxps_avx(auVar17,auVar18);
    auVar11 = vminps_avx(ZEXT1632(auVar95),ZEXT1632(auVar12));
    auVar18 = vmaxps_avx(ZEXT1632(auVar95),ZEXT1632(auVar12));
    auVar20 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar245));
    auVar11 = vminps_avx(auVar11,auVar20);
    auVar11 = vminps_avx(auVar19,auVar11);
    auVar19 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar245));
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar17,auVar18);
    auVar17 = vcmpps_avx(auVar11,auVar47,2);
    auVar18 = vcmpps_avx(auVar18,auVar46,5);
    auVar17 = vandps_avx(auVar18,auVar17);
    auVar81 = vandps_avx(auVar81,local_1b8);
    auVar18 = auVar81 & auVar17;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar81 = vandps_avx(auVar17,auVar81);
      uVar52 = vmovmskps_avx(auVar81);
      if (uVar52 != 0) {
        mask_stack[uVar56] = uVar52 & 0xff;
        BVar2 = (BBox1f)vmovlps_avx(auVar106);
        cu_stack[uVar56] = BVar2;
        BVar2 = (BBox1f)vmovlps_avx(auVar67);
        cv_stack[uVar56] = BVar2;
        uVar56 = (ulong)((int)uVar56 + 1);
      }
    }
  }
LAB_01185a47:
  if ((int)uVar56 == 0) {
    uVar53 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar80._4_4_ = uVar53;
    auVar80._0_4_ = uVar53;
    auVar80._8_4_ = uVar53;
    auVar80._12_4_ = uVar53;
    auVar106 = vcmpps_avx(auVar201,auVar80,2);
    uVar49 = vmovmskps_avx(auVar106);
    uVar54 = (ulong)((uint)uVar54 & uVar49);
    goto LAB_01184cd7;
  }
  uVar48 = (int)uVar56 - 1;
  uVar52 = mask_stack[uVar48];
  fVar60 = cu_stack[uVar48].lower;
  fVar87 = cu_stack[uVar48].upper;
  iVar23 = 0;
  for (uVar55 = (ulong)uVar52; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    iVar23 = iVar23 + 1;
  }
  uVar52 = uVar52 - 1 & uVar52;
  if (uVar52 == 0) {
    uVar56 = (ulong)uVar48;
  }
  auVar67._8_8_ = 0;
  auVar67._0_4_ = cv_stack[uVar48].lower;
  auVar67._4_4_ = cv_stack[uVar48].upper;
  mask_stack[uVar48] = uVar52;
  fVar122 = (float)(iVar23 + 1) * 0.14285715;
  auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar87 * (float)iVar23 * 0.14285715)),
                             ZEXT416((uint)fVar60),ZEXT416((uint)(1.0 - (float)iVar23 * 0.14285715))
                            );
  auVar213 = vfmadd231ss_fma(ZEXT416((uint)(fVar87 * fVar122)),ZEXT416((uint)fVar60),
                             ZEXT416((uint)(1.0 - fVar122)));
  fVar87 = auVar213._0_4_;
  auVar194._0_4_ = auVar106._0_4_;
  fVar60 = fVar87 - auVar194._0_4_;
  if (fVar60 < 0.16666667) {
    auVar130 = vshufps_avx(auVar67,auVar67,0x50);
    auVar96._8_4_ = 0x3f800000;
    auVar96._0_8_ = 0x3f8000003f800000;
    auVar96._12_4_ = 0x3f800000;
    auVar12 = vsubps_avx(auVar96,auVar130);
    fVar122 = auVar130._0_4_;
    auVar140._0_4_ = fVar122 * fVar135;
    fVar85 = auVar130._4_4_;
    auVar140._4_4_ = fVar85 * fVar146;
    fVar86 = auVar130._8_4_;
    auVar140._8_4_ = fVar86 * fVar135;
    fVar59 = auVar130._12_4_;
    auVar140._12_4_ = fVar59 * fVar146;
    auVar153._0_4_ = fVar122 * fVar249;
    auVar153._4_4_ = fVar85 * fVar261;
    auVar153._8_4_ = fVar86 * fVar249;
    auVar153._12_4_ = fVar59 * fVar261;
    auVar176._0_4_ = fVar122 * fVar200;
    auVar176._4_4_ = fVar85 * fVar210;
    auVar176._8_4_ = fVar86 * fVar200;
    auVar176._12_4_ = fVar59 * fVar210;
    auVar69._0_4_ = fVar122 * fVar211;
    auVar69._4_4_ = fVar85 * fVar227;
    auVar69._8_4_ = fVar86 * fVar211;
    auVar69._12_4_ = fVar59 * fVar227;
    auVar130 = vfmadd231ps_fma(auVar140,auVar12,auVar187);
    auVar65 = vfmadd231ps_fma(auVar153,auVar12,auVar232);
    auVar253 = vfmadd231ps_fma(auVar176,auVar12,auVar252);
    auVar12 = vfmadd231ps_fma(auVar69,auVar12,auVar266);
    auVar134._16_16_ = auVar130;
    auVar134._0_16_ = auVar130;
    auVar145._16_16_ = auVar65;
    auVar145._0_16_ = auVar65;
    auVar161._16_16_ = auVar253;
    auVar161._0_16_ = auVar253;
    auVar194._4_4_ = auVar194._0_4_;
    auVar194._8_4_ = auVar194._0_4_;
    auVar194._12_4_ = auVar194._0_4_;
    auVar194._20_4_ = fVar87;
    auVar194._16_4_ = fVar87;
    auVar194._24_4_ = fVar87;
    auVar194._28_4_ = fVar87;
    auVar81 = vsubps_avx(auVar145,auVar134);
    auVar65 = vfmadd213ps_fma(auVar81,auVar194,auVar134);
    auVar81 = vsubps_avx(auVar161,auVar145);
    auVar94 = vfmadd213ps_fma(auVar81,auVar194,auVar145);
    auVar130 = vsubps_avx(auVar12,auVar253);
    auVar83._16_16_ = auVar130;
    auVar83._0_16_ = auVar130;
    auVar130 = vfmadd213ps_fma(auVar83,auVar194,auVar161);
    auVar81 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar65));
    auVar12 = vfmadd213ps_fma(auVar81,auVar194,ZEXT1632(auVar65));
    auVar81 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar94));
    auVar130 = vfmadd213ps_fma(auVar81,auVar194,ZEXT1632(auVar94));
    auVar81 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar12));
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar81,auVar194);
    fVar228 = auVar81._4_4_ * 3.0;
    local_4d8._0_4_ = fVar60;
    fVar122 = fVar60 * 0.33333334;
    auVar97._0_8_ =
         CONCAT44(auVar113._4_4_ + fVar122 * fVar228,auVar113._0_4_ + fVar122 * auVar81._0_4_ * 3.0)
    ;
    auVar97._8_4_ = auVar113._8_4_ + fVar122 * auVar81._8_4_ * 3.0;
    auVar97._12_4_ = auVar113._12_4_ + fVar122 * auVar81._12_4_ * 3.0;
    auVar12 = vshufpd_avx(auVar113,auVar113,3);
    auVar65 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    _local_4f8 = auVar12;
    auVar130 = vsubps_avx(auVar12,auVar113);
    auVar253 = vsubps_avx(auVar65,(undefined1  [16])0x0);
    auVar70._0_4_ = auVar130._0_4_ + auVar253._0_4_;
    auVar70._4_4_ = auVar130._4_4_ + auVar253._4_4_;
    auVar70._8_4_ = auVar130._8_4_ + auVar253._8_4_;
    auVar70._12_4_ = auVar130._12_4_ + auVar253._12_4_;
    auVar130 = vshufps_avx(auVar113,auVar113,0xb1);
    auVar253 = vshufps_avx(auVar97,auVar97,0xb1);
    auVar278._4_4_ = auVar70._0_4_;
    auVar278._0_4_ = auVar70._0_4_;
    auVar278._8_4_ = auVar70._0_4_;
    auVar278._12_4_ = auVar70._0_4_;
    auVar94 = vshufps_avx(auVar70,auVar70,0x55);
    fVar85 = auVar94._0_4_;
    auVar71._0_4_ = fVar85 * auVar130._0_4_;
    fVar86 = auVar94._4_4_;
    auVar71._4_4_ = fVar86 * auVar130._4_4_;
    fVar59 = auVar94._8_4_;
    auVar71._8_4_ = fVar59 * auVar130._8_4_;
    fVar58 = auVar94._12_4_;
    auVar71._12_4_ = fVar58 * auVar130._12_4_;
    auVar154._0_4_ = fVar85 * auVar253._0_4_;
    auVar154._4_4_ = fVar86 * auVar253._4_4_;
    auVar154._8_4_ = fVar59 * auVar253._8_4_;
    auVar154._12_4_ = fVar58 * auVar253._12_4_;
    auVar95 = vfmadd231ps_fma(auVar71,auVar278,auVar113);
    auVar245 = vfmadd231ps_fma(auVar154,auVar278,auVar97);
    auVar253 = vshufps_avx(auVar95,auVar95,0xe8);
    auVar94 = vshufps_avx(auVar245,auVar245,0xe8);
    auVar130 = vcmpps_avx(auVar253,auVar94,1);
    uVar52 = vextractps_avx(auVar130,0);
    auVar114 = auVar245;
    if ((uVar52 & 1) == 0) {
      auVar114 = auVar95;
    }
    auVar126._0_4_ = fVar122 * auVar81._16_4_ * 3.0;
    auVar126._4_4_ = fVar122 * fVar228;
    auVar126._8_4_ = fVar122 * auVar81._24_4_ * 3.0;
    auVar126._12_4_ = fVar122 * auVar226._28_4_;
    auVar150 = vsubps_avx((undefined1  [16])0x0,auVar126);
    auVar127 = vshufps_avx(auVar150,auVar150,0xb1);
    auVar124 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar188._0_4_ = fVar85 * auVar127._0_4_;
    auVar188._4_4_ = fVar86 * auVar127._4_4_;
    auVar188._8_4_ = fVar59 * auVar127._8_4_;
    auVar188._12_4_ = fVar58 * auVar127._12_4_;
    auVar205._0_4_ = auVar124._0_4_ * fVar85;
    auVar205._4_4_ = auVar124._4_4_ * fVar86;
    auVar205._8_4_ = auVar124._8_4_ * fVar59;
    auVar205._12_4_ = auVar124._12_4_ * fVar58;
    auVar151 = vfmadd231ps_fma(auVar188,auVar278,auVar150);
    auVar152 = vfmadd231ps_fma(auVar205,(undefined1  [16])0x0,auVar278);
    auVar124 = vshufps_avx(auVar151,auVar151,0xe8);
    auVar138 = vshufps_avx(auVar152,auVar152,0xe8);
    auVar226 = ZEXT1664(auVar138);
    auVar127 = vcmpps_avx(auVar124,auVar138,1);
    uVar52 = vextractps_avx(auVar127,0);
    auVar164 = auVar152;
    if ((uVar52 & 1) == 0) {
      auVar164 = auVar151;
    }
    auVar114 = vmaxss_avx(auVar164,auVar114);
    auVar253 = vminps_avx(auVar253,auVar94);
    auVar94 = vminps_avx(auVar124,auVar138);
    auVar94 = vminps_avx(auVar253,auVar94);
    auVar130 = vshufps_avx(auVar130,auVar130,0x55);
    auVar130 = vblendps_avx(auVar130,auVar127,2);
    auVar127 = vpslld_avx(auVar130,0x1f);
    auVar130 = vshufpd_avx(auVar245,auVar245,1);
    auVar130 = vinsertps_avx(auVar130,auVar152,0x9c);
    auVar253 = vshufpd_avx(auVar95,auVar95,1);
    auVar253 = vinsertps_avx(auVar253,auVar151,0x9c);
    auVar130 = vblendvps_avx(auVar253,auVar130,auVar127);
    auVar253 = vmovshdup_avx(auVar130);
    auVar130 = vmaxss_avx(auVar253,auVar130);
    fVar59 = auVar94._0_4_;
    auVar253 = vmovshdup_avx(auVar94);
    fVar86 = auVar130._0_4_;
    fVar122 = auVar253._0_4_;
    fVar85 = auVar114._0_4_;
    if (((0.0001 <= fVar59) || (fVar86 <= -0.0001)) && (0.0001 <= fVar122 || fVar86 <= -0.0001))
    goto code_r0x01185d54;
    goto LAB_01185d7a;
  }
  auVar106 = vinsertps_avx(auVar106,auVar213,0x10);
  goto LAB_01185497;
code_r0x01185d54:
  auVar253 = vcmpps_avx(auVar253,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar95 = vcmpps_avx(auVar94,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar253 = vandps_avx(auVar95,auVar253);
  if (fVar85 <= -0.0001 || (auVar253 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_01185a47;
LAB_01185d7a:
  auVar95 = vcmpps_avx(auVar94,_DAT_01f45a50,1);
  auVar245 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar253 = vcmpss_avx(auVar114,ZEXT816(0) << 0x20,1);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = 0x3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar116._8_4_ = 0xbf800000;
  auVar116._0_8_ = 0xbf800000bf800000;
  auVar116._12_4_ = 0xbf800000;
  auVar253 = vblendvps_avx(auVar98,auVar116,auVar253);
  auVar95 = vblendvps_avx(auVar98,auVar116,auVar95);
  fVar228 = auVar95._0_4_;
  fVar58 = auVar253._0_4_;
  auVar253 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar228 == fVar58) && (!NAN(fVar228) && !NAN(fVar58))) {
    auVar253 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar228 == fVar58) && (!NAN(fVar228) && !NAN(fVar58))) {
    auVar245 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar95 = vmovshdup_avx(auVar95);
  fVar262 = auVar95._0_4_;
  if ((fVar228 != fVar262) || (NAN(fVar228) || NAN(fVar262))) {
    if ((fVar122 != fVar59) || (NAN(fVar122) || NAN(fVar59))) {
      auVar128._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
      auVar128._8_4_ = auVar94._8_4_ ^ 0x80000000;
      auVar128._12_4_ = auVar94._12_4_ ^ 0x80000000;
      auVar129._0_4_ = -fVar59 / (fVar122 - fVar59);
      auVar129._4_12_ = auVar128._4_12_;
      auVar94 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar129._0_4_)),auVar129,ZEXT416(0));
      auVar95 = auVar94;
    }
    else {
      auVar94 = ZEXT816(0) << 0x20;
      if ((fVar59 != 0.0) || (auVar95 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar59))) {
        auVar94 = SUB6416(ZEXT464(0x7f800000),0);
        auVar95 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar253 = vminss_avx(auVar253,auVar94);
    auVar245 = vmaxss_avx(auVar95,auVar245);
  }
  auVar130 = vcmpss_avx(auVar130,ZEXT416(0),1);
  auVar99._8_4_ = 0x3f800000;
  auVar99._0_8_ = 0x3f8000003f800000;
  auVar99._12_4_ = 0x3f800000;
  auVar117._8_4_ = 0xbf800000;
  auVar117._0_8_ = 0xbf800000bf800000;
  auVar117._12_4_ = 0xbf800000;
  auVar130 = vblendvps_avx(auVar99,auVar117,auVar130);
  fVar122 = auVar130._0_4_;
  if ((fVar58 != fVar122) || (NAN(fVar58) || NAN(fVar122))) {
    if ((fVar86 != fVar85) || (NAN(fVar86) || NAN(fVar85))) {
      auVar72._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
      auVar72._8_4_ = auVar114._8_4_ ^ 0x80000000;
      auVar72._12_4_ = auVar114._12_4_ ^ 0x80000000;
      auVar131._0_4_ = -fVar85 / (fVar86 - fVar85);
      auVar131._4_12_ = auVar72._4_12_;
      auVar130 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar131._0_4_)),auVar131,ZEXT416(0));
      auVar94 = auVar130;
    }
    else {
      auVar130 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar85 != 0.0) || (auVar94 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar85))) {
        auVar130 = SUB6416(ZEXT464(0xff800000),0);
        auVar94 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar253 = vminss_avx(auVar253,auVar94);
    auVar245 = vmaxss_avx(auVar130,auVar245);
  }
  if ((fVar262 != fVar122) || (NAN(fVar262) || NAN(fVar122))) {
    auVar253 = vminss_avx(auVar253,SUB6416(ZEXT464(0x3f800000),0));
    auVar245 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar245);
  }
  auVar130 = vmaxss_avx(ZEXT816(0) << 0x40,auVar253);
  auVar253 = vminss_avx(auVar245,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar253._0_4_ < auVar130._0_4_) goto LAB_01185a47;
  auVar130 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar130._0_4_ + -0.1)));
  auVar253 = vminss_avx(ZEXT416((uint)(auVar253._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar141._0_8_ = auVar113._0_8_;
  auVar141._8_8_ = auVar141._0_8_;
  auVar218._8_8_ = auVar97._0_8_;
  auVar218._0_8_ = auVar97._0_8_;
  auVar233._8_8_ = auVar150._0_8_;
  auVar233._0_8_ = auVar150._0_8_;
  auVar94 = vshufpd_avx(auVar97,auVar97,3);
  auVar95 = vshufpd_avx(auVar150,auVar150,3);
  auVar245 = vshufps_avx(auVar130,auVar253,0);
  auVar73._8_4_ = 0x3f800000;
  auVar73._0_8_ = 0x3f8000003f800000;
  auVar73._12_4_ = 0x3f800000;
  auVar113 = vsubps_avx(auVar73,auVar245);
  local_4f8._0_4_ = auVar12._0_4_;
  local_4f8._4_4_ = auVar12._4_4_;
  fStack_4f0 = auVar12._8_4_;
  fStack_4ec = auVar12._12_4_;
  fVar122 = auVar245._0_4_;
  auVar74._0_4_ = fVar122 * (float)local_4f8._0_4_;
  fVar85 = auVar245._4_4_;
  auVar74._4_4_ = fVar85 * (float)local_4f8._4_4_;
  fVar86 = auVar245._8_4_;
  auVar74._8_4_ = fVar86 * fStack_4f0;
  fVar59 = auVar245._12_4_;
  auVar74._12_4_ = fVar59 * fStack_4ec;
  auVar177._0_4_ = fVar122 * auVar94._0_4_;
  auVar177._4_4_ = fVar85 * auVar94._4_4_;
  auVar177._8_4_ = fVar86 * auVar94._8_4_;
  auVar177._12_4_ = fVar59 * auVar94._12_4_;
  auVar189._0_4_ = fVar122 * auVar95._0_4_;
  auVar189._4_4_ = fVar85 * auVar95._4_4_;
  auVar189._8_4_ = fVar86 * auVar95._8_4_;
  auVar189._12_4_ = fVar59 * auVar95._12_4_;
  auVar206._0_4_ = fVar122 * auVar65._0_4_;
  auVar206._4_4_ = fVar85 * auVar65._4_4_;
  auVar206._8_4_ = fVar86 * auVar65._8_4_;
  auVar206._12_4_ = fVar59 * auVar65._12_4_;
  auVar94 = vfmadd231ps_fma(auVar74,auVar113,auVar141);
  auVar95 = vfmadd231ps_fma(auVar177,auVar113,auVar218);
  auVar245 = vfmadd231ps_fma(auVar189,auVar113,auVar233);
  auVar113 = vfmadd231ps_fma(auVar206,auVar113,ZEXT816(0));
  auVar12 = vmovshdup_avx(auVar67);
  auVar138 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * auVar130._0_4_)),auVar67,
                             ZEXT416((uint)(1.0 - auVar130._0_4_)));
  auVar150 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * auVar253._0_4_)),auVar67,
                             ZEXT416((uint)(1.0 - auVar253._0_4_)));
  fVar122 = 1.0 / fVar60;
  auVar67 = vsubps_avx(auVar95,auVar94);
  auVar219._0_4_ = auVar67._0_4_ * 3.0;
  auVar219._4_4_ = auVar67._4_4_ * 3.0;
  auVar219._8_4_ = auVar67._8_4_ * 3.0;
  auVar219._12_4_ = auVar67._12_4_ * 3.0;
  auVar67 = vsubps_avx(auVar245,auVar95);
  auVar234._0_4_ = auVar67._0_4_ * 3.0;
  auVar234._4_4_ = auVar67._4_4_ * 3.0;
  auVar234._8_4_ = auVar67._8_4_ * 3.0;
  auVar234._12_4_ = auVar67._12_4_ * 3.0;
  auVar67 = vsubps_avx(auVar113,auVar245);
  auVar246._0_4_ = auVar67._0_4_ * 3.0;
  auVar246._4_4_ = auVar67._4_4_ * 3.0;
  auVar246._8_4_ = auVar67._8_4_ * 3.0;
  auVar246._12_4_ = auVar67._12_4_ * 3.0;
  auVar130 = vminps_avx(auVar234,auVar246);
  auVar67 = vmaxps_avx(auVar234,auVar246);
  auVar130 = vminps_avx(auVar219,auVar130);
  auVar67 = vmaxps_avx(auVar219,auVar67);
  auVar12 = vshufpd_avx(auVar130,auVar130,3);
  auVar65 = vshufpd_avx(auVar67,auVar67,3);
  auVar130 = vminps_avx(auVar130,auVar12);
  auVar67 = vmaxps_avx(auVar67,auVar65);
  auVar235._0_4_ = auVar130._0_4_ * fVar122;
  auVar235._4_4_ = auVar130._4_4_ * fVar122;
  auVar235._8_4_ = auVar130._8_4_ * fVar122;
  auVar235._12_4_ = auVar130._12_4_ * fVar122;
  auVar220._0_4_ = auVar67._0_4_ * fVar122;
  auVar220._4_4_ = auVar67._4_4_ * fVar122;
  auVar220._8_4_ = auVar67._8_4_ * fVar122;
  auVar220._12_4_ = auVar67._12_4_ * fVar122;
  fVar122 = 1.0 / (auVar150._0_4_ - auVar138._0_4_);
  auVar67 = vshufpd_avx(auVar94,auVar94,3);
  auVar130 = vshufpd_avx(auVar95,auVar95,3);
  auVar12 = vshufpd_avx(auVar245,auVar245,3);
  auVar65 = vshufpd_avx(auVar113,auVar113,3);
  auVar67 = vsubps_avx(auVar67,auVar94);
  auVar253 = vsubps_avx(auVar130,auVar95);
  auVar94 = vsubps_avx(auVar12,auVar245);
  auVar65 = vsubps_avx(auVar65,auVar113);
  auVar130 = vminps_avx(auVar67,auVar253);
  auVar67 = vmaxps_avx(auVar67,auVar253);
  auVar12 = vminps_avx(auVar94,auVar65);
  auVar12 = vminps_avx(auVar130,auVar12);
  auVar130 = vmaxps_avx(auVar94,auVar65);
  auVar67 = vmaxps_avx(auVar67,auVar130);
  auVar267._0_4_ = fVar122 * auVar12._0_4_;
  auVar267._4_4_ = fVar122 * auVar12._4_4_;
  auVar267._8_4_ = fVar122 * auVar12._8_4_;
  auVar267._12_4_ = fVar122 * auVar12._12_4_;
  auVar254._0_4_ = fVar122 * auVar67._0_4_;
  auVar254._4_4_ = fVar122 * auVar67._4_4_;
  auVar254._8_4_ = fVar122 * auVar67._8_4_;
  auVar254._12_4_ = fVar122 * auVar67._12_4_;
  auVar65 = vinsertps_avx(auVar106,auVar138,0x10);
  auVar253 = vinsertps_avx(auVar213,auVar150,0x10);
  auVar247._0_4_ = (auVar65._0_4_ + auVar253._0_4_) * 0.5;
  auVar247._4_4_ = (auVar65._4_4_ + auVar253._4_4_) * 0.5;
  auVar247._8_4_ = (auVar65._8_4_ + auVar253._8_4_) * 0.5;
  auVar247._12_4_ = (auVar65._12_4_ + auVar253._12_4_) * 0.5;
  auVar75._4_4_ = auVar247._0_4_;
  auVar75._0_4_ = auVar247._0_4_;
  auVar75._8_4_ = auVar247._0_4_;
  auVar75._12_4_ = auVar247._0_4_;
  auVar67 = vfmadd213ps_fma(auVar10,auVar75,auVar14);
  auVar130 = vfmadd213ps_fma(auVar13,auVar75,auVar15);
  auVar12 = vfmadd213ps_fma(auVar149,auVar75,auVar16);
  auVar213 = vsubps_avx(auVar130,auVar67);
  auVar67 = vfmadd213ps_fma(auVar213,auVar75,auVar67);
  auVar213 = vsubps_avx(auVar12,auVar130);
  auVar213 = vfmadd213ps_fma(auVar213,auVar75,auVar130);
  auVar213 = vsubps_avx(auVar213,auVar67);
  auVar67 = vfmadd231ps_fma(auVar67,auVar213,auVar75);
  auVar76._0_8_ = CONCAT44(auVar213._4_4_ * 3.0,auVar213._0_4_ * 3.0);
  auVar76._8_4_ = auVar213._8_4_ * 3.0;
  auVar76._12_4_ = auVar213._12_4_ * 3.0;
  auVar279._8_8_ = auVar67._0_8_;
  auVar279._0_8_ = auVar67._0_8_;
  auVar213 = vshufpd_avx(auVar67,auVar67,3);
  auVar67 = vshufps_avx(auVar247,auVar247,0x55);
  auVar95 = vsubps_avx(auVar213,auVar279);
  auVar113 = vfmadd231ps_fma(auVar279,auVar67,auVar95);
  auVar286._8_8_ = auVar76._0_8_;
  auVar286._0_8_ = auVar76._0_8_;
  auVar213 = vshufpd_avx(auVar76,auVar76,3);
  auVar213 = vsubps_avx(auVar213,auVar286);
  auVar245 = vfmadd213ps_fma(auVar213,auVar67,auVar286);
  auVar67 = vmovshdup_avx(auVar245);
  auVar287._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
  auVar287._8_4_ = auVar67._8_4_ ^ 0x80000000;
  auVar287._12_4_ = auVar67._12_4_ ^ 0x80000000;
  auVar130 = vmovshdup_avx(auVar95);
  auVar213 = vunpcklps_avx(auVar130,auVar287);
  auVar12 = vshufps_avx(auVar213,auVar287,4);
  auVar94 = vshufps_avx(auVar247,auVar247,0x54);
  auVar132._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
  auVar132._8_4_ = auVar95._8_4_ ^ 0x80000000;
  auVar132._12_4_ = auVar95._12_4_ ^ 0x80000000;
  auVar213 = vmovlhps_avx(auVar132,auVar245);
  auVar213 = vshufps_avx(auVar213,auVar245,8);
  auVar67 = vfmsub231ss_fma(ZEXT416((uint)(auVar95._0_4_ * auVar67._0_4_)),auVar130,auVar245);
  uVar53 = auVar67._0_4_;
  auVar77._4_4_ = uVar53;
  auVar77._0_4_ = uVar53;
  auVar77._8_4_ = uVar53;
  auVar77._12_4_ = uVar53;
  auVar67 = vdivps_avx(auVar12,auVar77);
  auVar130 = vdivps_avx(auVar213,auVar77);
  fVar86 = auVar113._0_4_;
  fVar122 = auVar67._0_4_;
  auVar213 = vshufps_avx(auVar113,auVar113,0x55);
  fVar85 = auVar130._0_4_;
  auVar78._0_4_ = fVar86 * fVar122 + auVar213._0_4_ * fVar85;
  auVar78._4_4_ = fVar86 * auVar67._4_4_ + auVar213._4_4_ * auVar130._4_4_;
  auVar78._8_4_ = fVar86 * auVar67._8_4_ + auVar213._8_4_ * auVar130._8_4_;
  auVar78._12_4_ = fVar86 * auVar67._12_4_ + auVar213._12_4_ * auVar130._12_4_;
  auVar124 = vsubps_avx(auVar94,auVar78);
  auVar94 = vmovshdup_avx(auVar67);
  auVar213 = vinsertps_avx(auVar235,auVar267,0x1c);
  auVar155._0_4_ = auVar94._0_4_ * auVar213._0_4_;
  auVar155._4_4_ = auVar94._4_4_ * auVar213._4_4_;
  auVar155._8_4_ = auVar94._8_4_ * auVar213._8_4_;
  auVar155._12_4_ = auVar94._12_4_ * auVar213._12_4_;
  auVar12 = vinsertps_avx(auVar220,auVar254,0x1c);
  auVar100._0_4_ = auVar12._0_4_ * auVar94._0_4_;
  auVar100._4_4_ = auVar12._4_4_ * auVar94._4_4_;
  auVar100._8_4_ = auVar12._8_4_ * auVar94._8_4_;
  auVar100._12_4_ = auVar12._12_4_ * auVar94._12_4_;
  auVar113 = vminps_avx(auVar155,auVar100);
  auVar245 = vmaxps_avx(auVar100,auVar155);
  auVar94 = vinsertps_avx(auVar267,auVar235,0x4c);
  auVar114 = vmovshdup_avx(auVar130);
  auVar95 = vinsertps_avx(auVar254,auVar220,0x4c);
  auVar255._0_4_ = auVar114._0_4_ * auVar94._0_4_;
  auVar255._4_4_ = auVar114._4_4_ * auVar94._4_4_;
  auVar255._8_4_ = auVar114._8_4_ * auVar94._8_4_;
  auVar255._12_4_ = auVar114._12_4_ * auVar94._12_4_;
  auVar236._0_4_ = auVar114._0_4_ * auVar95._0_4_;
  auVar236._4_4_ = auVar114._4_4_ * auVar95._4_4_;
  auVar236._8_4_ = auVar114._8_4_ * auVar95._8_4_;
  auVar236._12_4_ = auVar114._12_4_ * auVar95._12_4_;
  auVar114 = vminps_avx(auVar255,auVar236);
  auVar268._0_4_ = auVar113._0_4_ + auVar114._0_4_;
  auVar268._4_4_ = auVar113._4_4_ + auVar114._4_4_;
  auVar268._8_4_ = auVar113._8_4_ + auVar114._8_4_;
  auVar268._12_4_ = auVar113._12_4_ + auVar114._12_4_;
  auVar113 = vmaxps_avx(auVar236,auVar255);
  auVar101._0_4_ = auVar113._0_4_ + auVar245._0_4_;
  auVar101._4_4_ = auVar113._4_4_ + auVar245._4_4_;
  auVar101._8_4_ = auVar113._8_4_ + auVar245._8_4_;
  auVar101._12_4_ = auVar113._12_4_ + auVar245._12_4_;
  auVar237._8_8_ = 0x3f80000000000000;
  auVar237._0_8_ = 0x3f80000000000000;
  auVar245 = vsubps_avx(auVar237,auVar101);
  auVar113 = vsubps_avx(auVar237,auVar268);
  auVar114 = vsubps_avx(auVar65,auVar247);
  auVar127 = vsubps_avx(auVar253,auVar247);
  auVar118._0_4_ = fVar122 * auVar213._0_4_;
  auVar118._4_4_ = fVar122 * auVar213._4_4_;
  auVar118._8_4_ = fVar122 * auVar213._8_4_;
  auVar118._12_4_ = fVar122 * auVar213._12_4_;
  auVar269._0_4_ = fVar122 * auVar12._0_4_;
  auVar269._4_4_ = fVar122 * auVar12._4_4_;
  auVar269._8_4_ = fVar122 * auVar12._8_4_;
  auVar269._12_4_ = fVar122 * auVar12._12_4_;
  auVar12 = vminps_avx(auVar118,auVar269);
  auVar213 = vmaxps_avx(auVar269,auVar118);
  auVar156._0_4_ = fVar85 * auVar94._0_4_;
  auVar156._4_4_ = fVar85 * auVar94._4_4_;
  auVar156._8_4_ = fVar85 * auVar94._8_4_;
  auVar156._12_4_ = fVar85 * auVar94._12_4_;
  auVar221._0_4_ = fVar85 * auVar95._0_4_;
  auVar221._4_4_ = fVar85 * auVar95._4_4_;
  auVar221._8_4_ = fVar85 * auVar95._8_4_;
  auVar221._12_4_ = fVar85 * auVar95._12_4_;
  auVar94 = vminps_avx(auVar156,auVar221);
  auVar270._0_4_ = auVar12._0_4_ + auVar94._0_4_;
  auVar270._4_4_ = auVar12._4_4_ + auVar94._4_4_;
  auVar270._8_4_ = auVar12._8_4_ + auVar94._8_4_;
  auVar270._12_4_ = auVar12._12_4_ + auVar94._12_4_;
  fVar262 = auVar114._0_4_;
  auVar280._0_4_ = fVar262 * auVar245._0_4_;
  fVar263 = auVar114._4_4_;
  auVar280._4_4_ = fVar263 * auVar245._4_4_;
  fVar195 = auVar114._8_4_;
  auVar280._8_4_ = fVar195 * auVar245._8_4_;
  fVar196 = auVar114._12_4_;
  auVar280._12_4_ = fVar196 * auVar245._12_4_;
  auVar12 = vmaxps_avx(auVar221,auVar156);
  auVar222._0_4_ = fVar262 * auVar113._0_4_;
  auVar222._4_4_ = fVar263 * auVar113._4_4_;
  auVar222._8_4_ = fVar195 * auVar113._8_4_;
  auVar222._12_4_ = fVar196 * auVar113._12_4_;
  fVar86 = auVar127._0_4_;
  auVar102._0_4_ = fVar86 * auVar245._0_4_;
  fVar59 = auVar127._4_4_;
  auVar102._4_4_ = fVar59 * auVar245._4_4_;
  fVar58 = auVar127._8_4_;
  auVar102._8_4_ = fVar58 * auVar245._8_4_;
  fVar228 = auVar127._12_4_;
  auVar102._12_4_ = fVar228 * auVar245._12_4_;
  auVar238._0_4_ = fVar86 * auVar113._0_4_;
  auVar238._4_4_ = fVar59 * auVar113._4_4_;
  auVar238._8_4_ = fVar58 * auVar113._8_4_;
  auVar238._12_4_ = fVar228 * auVar113._12_4_;
  auVar119._0_4_ = auVar213._0_4_ + auVar12._0_4_;
  auVar119._4_4_ = auVar213._4_4_ + auVar12._4_4_;
  auVar119._8_4_ = auVar213._8_4_ + auVar12._8_4_;
  auVar119._12_4_ = auVar213._12_4_ + auVar12._12_4_;
  auVar157._8_8_ = 0x3f800000;
  auVar157._0_8_ = 0x3f800000;
  auVar213 = vsubps_avx(auVar157,auVar119);
  auVar12 = vsubps_avx(auVar157,auVar270);
  auVar271._0_4_ = fVar262 * auVar213._0_4_;
  auVar271._4_4_ = fVar263 * auVar213._4_4_;
  auVar271._8_4_ = fVar195 * auVar213._8_4_;
  auVar271._12_4_ = fVar196 * auVar213._12_4_;
  auVar256._0_4_ = fVar262 * auVar12._0_4_;
  auVar256._4_4_ = fVar263 * auVar12._4_4_;
  auVar256._8_4_ = fVar195 * auVar12._8_4_;
  auVar256._12_4_ = fVar196 * auVar12._12_4_;
  auVar120._0_4_ = fVar86 * auVar213._0_4_;
  auVar120._4_4_ = fVar59 * auVar213._4_4_;
  auVar120._8_4_ = fVar58 * auVar213._8_4_;
  auVar120._12_4_ = fVar228 * auVar213._12_4_;
  auVar158._0_4_ = fVar86 * auVar12._0_4_;
  auVar158._4_4_ = fVar59 * auVar12._4_4_;
  auVar158._8_4_ = fVar58 * auVar12._8_4_;
  auVar158._12_4_ = fVar228 * auVar12._12_4_;
  auVar213 = vminps_avx(auVar271,auVar256);
  auVar12 = vminps_avx(auVar120,auVar158);
  auVar213 = vminps_avx(auVar213,auVar12);
  auVar12 = vmaxps_avx(auVar256,auVar271);
  auVar94 = vmaxps_avx(auVar158,auVar120);
  auVar95 = vminps_avx(auVar280,auVar222);
  auVar245 = vminps_avx(auVar102,auVar238);
  auVar95 = vminps_avx(auVar95,auVar245);
  auVar213 = vhaddps_avx(auVar213,auVar95);
  auVar12 = vmaxps_avx(auVar94,auVar12);
  auVar94 = vmaxps_avx(auVar222,auVar280);
  auVar95 = vmaxps_avx(auVar238,auVar102);
  auVar94 = vmaxps_avx(auVar95,auVar94);
  auVar12 = vhaddps_avx(auVar12,auVar94);
  auVar213 = vshufps_avx(auVar213,auVar213,0xe8);
  auVar12 = vshufps_avx(auVar12,auVar12,0xe8);
  auVar239._0_4_ = auVar124._0_4_ + auVar213._0_4_;
  auVar239._4_4_ = auVar124._4_4_ + auVar213._4_4_;
  auVar239._8_4_ = auVar124._8_4_ + auVar213._8_4_;
  auVar239._12_4_ = auVar124._12_4_ + auVar213._12_4_;
  auVar223._0_4_ = auVar124._0_4_ + auVar12._0_4_;
  auVar223._4_4_ = auVar124._4_4_ + auVar12._4_4_;
  auVar223._8_4_ = auVar124._8_4_ + auVar12._8_4_;
  auVar223._12_4_ = auVar124._12_4_ + auVar12._12_4_;
  auVar226 = ZEXT1664(auVar223);
  auVar213 = vmaxps_avx(auVar65,auVar239);
  auVar12 = vminps_avx(auVar223,auVar253);
  auVar213 = vcmpps_avx(auVar12,auVar213,1);
  auVar213 = vshufps_avx(auVar213,auVar213,0x50);
  if ((auVar213 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar213[0xf] < '\0')
  goto LAB_01185a47;
  bVar51 = 0;
  if ((auVar194._0_4_ < auVar239._0_4_) && (bVar51 = 0, auVar223._0_4_ < auVar253._0_4_)) {
    auVar12 = vmovshdup_avx(auVar239);
    auVar213 = vcmpps_avx(auVar223,auVar253,1);
    bVar51 = auVar213[4] & auVar138._0_4_ < auVar12._0_4_;
  }
  p03.field_0.i[0] = auVar64._0_4_;
  p03.field_0.i[1] = auVar64._4_4_;
  p03.field_0.i[2] = auVar64._8_4_;
  p03.field_0.i[3] = auVar64._12_4_;
  if (((3 < (uint)uVar56 || fVar60 < 0.001) | bVar51) == 1) {
    lVar50 = 0xc9;
    auVar226 = ZEXT464(0x40400000);
    do {
      lVar50 = lVar50 + -1;
      if (lVar50 == 0) goto LAB_01185a47;
      fVar59 = auVar124._0_4_;
      fVar86 = 1.0 - fVar59;
      fVar60 = fVar86 * fVar86 * fVar86;
      fVar87 = fVar59 * 3.0 * fVar86 * fVar86;
      fVar86 = fVar86 * fVar59 * fVar59 * 3.0;
      auVar142._4_4_ = fVar60;
      auVar142._0_4_ = fVar60;
      auVar142._8_4_ = fVar60;
      auVar142._12_4_ = fVar60;
      auVar121._4_4_ = fVar87;
      auVar121._0_4_ = fVar87;
      auVar121._8_4_ = fVar87;
      auVar121._12_4_ = fVar87;
      auVar103._4_4_ = fVar86;
      auVar103._0_4_ = fVar86;
      auVar103._8_4_ = fVar86;
      auVar103._12_4_ = fVar86;
      fVar59 = fVar59 * fVar59 * fVar59;
      auVar159._0_4_ = p03.field_0.v[0] * fVar59;
      auVar159._4_4_ = p03.field_0.v[1] * fVar59;
      auVar159._8_4_ = p03.field_0.v[2] * fVar59;
      auVar159._12_4_ = p03.field_0.v[3] * fVar59;
      auVar106 = vfmadd231ps_fma(auVar159,auVar16,auVar103);
      auVar106 = vfmadd231ps_fma(auVar106,auVar15,auVar121);
      auVar106 = vfmadd231ps_fma(auVar106,auVar14,auVar142);
      auVar104._8_8_ = auVar106._0_8_;
      auVar104._0_8_ = auVar106._0_8_;
      auVar106 = vshufpd_avx(auVar106,auVar106,3);
      auVar213 = vshufps_avx(auVar124,auVar124,0x55);
      auVar106 = vsubps_avx(auVar106,auVar104);
      auVar213 = vfmadd213ps_fma(auVar106,auVar213,auVar104);
      fVar60 = auVar213._0_4_;
      auVar106 = vshufps_avx(auVar213,auVar213,0x55);
      auVar105._0_4_ = fVar122 * fVar60 + fVar85 * auVar106._0_4_;
      auVar105._4_4_ = auVar67._4_4_ * fVar60 + auVar130._4_4_ * auVar106._4_4_;
      auVar105._8_4_ = auVar67._8_4_ * fVar60 + auVar130._8_4_ * auVar106._8_4_;
      auVar105._12_4_ = auVar67._12_4_ * fVar60 + auVar130._12_4_ * auVar106._12_4_;
      auVar124 = vsubps_avx(auVar124,auVar105);
      auVar106 = vandps_avx(auVar243,auVar213);
      auVar213 = vshufps_avx(auVar106,auVar106,0xf5);
      auVar106 = vmaxss_avx(auVar213,auVar106);
    } while (fVar84 <= auVar106._0_4_);
    fVar60 = auVar124._0_4_;
    if ((0.0 <= fVar60) && (fVar60 <= 1.0)) {
      auVar106 = vmovshdup_avx(auVar124);
      fVar87 = auVar106._0_4_;
      if ((0.0 <= fVar87) && (fVar87 <= 1.0)) {
        auVar106 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                 ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar94 = vinsertps_avx(auVar106,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar106 = vdpps_avx(auVar94,auVar62,0x7f);
        auVar213 = vdpps_avx(auVar94,auVar92,0x7f);
        auVar67 = vdpps_avx(auVar94,auVar123,0x7f);
        auVar130 = vdpps_avx(auVar94,auVar137,0x7f);
        auVar12 = vdpps_avx(auVar94,auVar61,0x7f);
        auVar65 = vdpps_avx(auVar94,auVar90,0x7f);
        auVar253 = vdpps_avx(auVar94,auVar147,0x7f);
        auVar94 = vdpps_avx(auVar94,auVar148,0x7f);
        fVar122 = 1.0 - fVar87;
        auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar87 * auVar12._0_4_)),ZEXT416((uint)fVar122),
                                   auVar106);
        auVar213 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * fVar87)),ZEXT416((uint)fVar122),
                                   auVar213);
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar253._0_4_ * fVar87)),ZEXT416((uint)fVar122),
                                  auVar67);
        auVar226 = ZEXT1664(auVar67);
        auVar130 = vfmadd231ss_fma(ZEXT416((uint)(fVar87 * auVar94._0_4_)),ZEXT416((uint)fVar122),
                                   auVar130);
        fVar59 = 1.0 - fVar60;
        fVar122 = fVar59 * fVar60 * fVar60 * 3.0;
        fVar228 = fVar60 * fVar60 * fVar60;
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * auVar130._0_4_)),ZEXT416((uint)fVar122),
                                  auVar67);
        fVar85 = fVar60 * 3.0 * fVar59 * fVar59;
        auVar213 = vfmadd231ss_fma(auVar67,ZEXT416((uint)fVar85),auVar213);
        fVar86 = fVar59 * fVar59 * fVar59;
        auVar106 = vfmadd231ss_fma(auVar213,ZEXT416((uint)fVar86),auVar106);
        fVar58 = auVar106._0_4_;
        if (((fVar57 <= fVar58) && (fVar262 = *(float *)(ray + k * 4 + 0x80), fVar58 <= fVar262)) &&
           (pGVar6 = (context->scene->geometries).items[uVar49].ptr,
           (pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
          auVar106 = vshufps_avx(auVar124,auVar124,0x55);
          auVar224._8_4_ = 0x3f800000;
          auVar224._0_8_ = 0x3f8000003f800000;
          auVar224._12_4_ = 0x3f800000;
          auVar213 = vsubps_avx(auVar224,auVar106);
          fVar263 = auVar106._0_4_;
          auVar240._0_4_ = fVar263 * auVar231._0_4_;
          fVar195 = auVar106._4_4_;
          auVar240._4_4_ = fVar195 * auVar231._4_4_;
          fVar196 = auVar106._8_4_;
          auVar240._8_4_ = fVar196 * auVar231._8_4_;
          fVar197 = auVar106._12_4_;
          auVar240._12_4_ = fVar197 * auVar231._12_4_;
          auVar248._0_4_ = fVar263 * auVar66._0_4_;
          auVar248._4_4_ = fVar195 * auVar66._4_4_;
          auVar248._8_4_ = fVar196 * auVar66._8_4_;
          auVar248._12_4_ = fVar197 * auVar66._12_4_;
          local_488 = auVar136._0_4_;
          fStack_484 = auVar136._4_4_;
          fStack_480 = auVar136._8_4_;
          fStack_47c = auVar136._12_4_;
          auVar257._0_4_ = fVar263 * local_488;
          auVar257._4_4_ = fVar195 * fStack_484;
          auVar257._8_4_ = fVar196 * fStack_480;
          auVar257._12_4_ = fVar197 * fStack_47c;
          auVar272._0_4_ = fVar263 * fVar162;
          auVar272._4_4_ = fVar195 * fVar180;
          auVar272._8_4_ = fVar196 * fVar181;
          auVar272._12_4_ = fVar197 * fVar182;
          auVar67 = vfmadd231ps_fma(auVar240,auVar213,auVar63);
          auVar130 = vfmadd231ps_fma(auVar248,auVar213,auVar125);
          auVar12 = vfmadd231ps_fma(auVar257,auVar213,auVar91);
          auVar65 = vfmadd231ps_fma(auVar272,auVar213,auVar112);
          auVar213 = vsubps_avx(auVar130,auVar67);
          auVar67 = vsubps_avx(auVar12,auVar130);
          auVar130 = vsubps_avx(auVar65,auVar12);
          local_218._4_4_ = fVar60;
          local_218._0_4_ = fVar60;
          local_218._8_4_ = fVar60;
          local_218._12_4_ = fVar60;
          auVar226 = ZEXT1664(local_218);
          auVar273._0_4_ = fVar60 * auVar67._0_4_;
          auVar273._4_4_ = fVar60 * auVar67._4_4_;
          auVar273._8_4_ = fVar60 * auVar67._8_4_;
          auVar273._12_4_ = fVar60 * auVar67._12_4_;
          auVar207._4_4_ = fVar59;
          auVar207._0_4_ = fVar59;
          auVar207._8_4_ = fVar59;
          auVar207._12_4_ = fVar59;
          auVar213 = vfmadd231ps_fma(auVar273,auVar207,auVar213);
          auVar241._0_4_ = fVar60 * auVar130._0_4_;
          auVar241._4_4_ = fVar60 * auVar130._4_4_;
          auVar241._8_4_ = fVar60 * auVar130._8_4_;
          auVar241._12_4_ = fVar60 * auVar130._12_4_;
          auVar67 = vfmadd231ps_fma(auVar241,auVar207,auVar67);
          auVar242._0_4_ = fVar60 * auVar67._0_4_;
          auVar242._4_4_ = fVar60 * auVar67._4_4_;
          auVar242._8_4_ = fVar60 * auVar67._8_4_;
          auVar242._12_4_ = fVar60 * auVar67._12_4_;
          auVar67 = vfmadd231ps_fma(auVar242,auVar207,auVar213);
          local_368 = auVar212._0_4_;
          fStack_364 = auVar212._4_4_;
          fStack_360 = auVar212._8_4_;
          fStack_35c = auVar212._12_4_;
          auVar190._0_4_ = fVar228 * local_368;
          auVar190._4_4_ = fVar228 * fStack_364;
          auVar190._8_4_ = fVar228 * fStack_360;
          auVar190._12_4_ = fVar228 * fStack_35c;
          auVar143._4_4_ = fVar122;
          auVar143._0_4_ = fVar122;
          auVar143._8_4_ = fVar122;
          auVar143._12_4_ = fVar122;
          auVar213 = vfmadd132ps_fma(auVar143,auVar190,auVar184);
          auVar178._4_4_ = fVar85;
          auVar178._0_4_ = fVar85;
          auVar178._8_4_ = fVar85;
          auVar178._12_4_ = fVar85;
          auVar213 = vfmadd132ps_fma(auVar178,auVar213,auVar183);
          auVar191._0_4_ = auVar67._0_4_ * 3.0;
          auVar191._4_4_ = auVar67._4_4_ * 3.0;
          auVar191._8_4_ = auVar67._8_4_ * 3.0;
          auVar191._12_4_ = auVar67._12_4_ * 3.0;
          auVar160._4_4_ = fVar86;
          auVar160._0_4_ = fVar86;
          auVar160._8_4_ = fVar86;
          auVar160._12_4_ = fVar86;
          auVar67 = vfmadd132ps_fma(auVar160,auVar213,auVar163);
          auVar213 = vshufps_avx(auVar191,auVar191,0xc9);
          auVar144._0_4_ = auVar67._0_4_ * auVar213._0_4_;
          auVar144._4_4_ = auVar67._4_4_ * auVar213._4_4_;
          auVar144._8_4_ = auVar67._8_4_ * auVar213._8_4_;
          auVar144._12_4_ = auVar67._12_4_ * auVar213._12_4_;
          auVar213 = vshufps_avx(auVar67,auVar67,0xc9);
          auVar213 = vfmsub231ps_fma(auVar144,auVar191,auVar213);
          local_228 = auVar213._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x80) = fVar58;
            uVar53 = vextractps_avx(auVar213,1);
            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar53;
            uVar53 = vextractps_avx(auVar213,2);
            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar53;
            *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
            *(float *)(ray + k * 4 + 0xf0) = fVar60;
            *(float *)(ray + k * 4 + 0x100) = fVar87;
            *(uint *)(ray + k * 4 + 0x110) = uVar5;
            *(uint *)(ray + k * 4 + 0x120) = uVar49;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
          else {
            auVar67 = vshufps_avx(auVar213,auVar213,0x55);
            auVar213 = vshufps_avx(auVar213,auVar213,0xaa);
            local_248[0] = (RTCHitN)auVar67[0];
            local_248[1] = (RTCHitN)auVar67[1];
            local_248[2] = (RTCHitN)auVar67[2];
            local_248[3] = (RTCHitN)auVar67[3];
            local_248[4] = (RTCHitN)auVar67[4];
            local_248[5] = (RTCHitN)auVar67[5];
            local_248[6] = (RTCHitN)auVar67[6];
            local_248[7] = (RTCHitN)auVar67[7];
            local_248[8] = (RTCHitN)auVar67[8];
            local_248[9] = (RTCHitN)auVar67[9];
            local_248[10] = (RTCHitN)auVar67[10];
            local_248[0xb] = (RTCHitN)auVar67[0xb];
            local_248[0xc] = (RTCHitN)auVar67[0xc];
            local_248[0xd] = (RTCHitN)auVar67[0xd];
            local_248[0xe] = (RTCHitN)auVar67[0xe];
            local_248[0xf] = (RTCHitN)auVar67[0xf];
            local_238 = auVar213;
            uStack_224 = local_228;
            uStack_220 = local_228;
            uStack_21c = local_228;
            local_208 = auVar106;
            local_1f8 = CONCAT44(uVar5,uVar5);
            uStack_1f0 = CONCAT44(uVar5,uVar5);
            local_1e8._4_4_ = uVar49;
            local_1e8._0_4_ = uVar49;
            local_1e8._8_4_ = uVar49;
            local_1e8._12_4_ = uVar49;
            vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
            uStack_1d4 = context->user->instID[0];
            local_1d8 = uStack_1d4;
            uStack_1d0 = uStack_1d4;
            uStack_1cc = uStack_1d4;
            uStack_1c8 = context->user->instPrimID[0];
            uStack_1c4 = uStack_1c8;
            uStack_1c0 = uStack_1c8;
            uStack_1bc = uStack_1c8;
            *(float *)(ray + k * 4 + 0x80) = fVar58;
            local_518 = *local_500;
            args.valid = (int *)local_518;
            args.geometryUserPtr = pGVar6->userPtr;
            args.context = context->user;
            args.hit = local_248;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              auVar226 = ZEXT1664(local_218);
              (*pGVar6->intersectionFilterN)(&args);
              auVar111._8_56_ = extraout_var;
              auVar111._0_8_ = extraout_XMM1_Qa;
              auVar213 = auVar111._0_16_;
            }
            if (local_518 == (undefined1  [16])0x0) {
              auVar106 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar213 = vpcmpeqd_avx(auVar213,auVar213);
              auVar106 = auVar106 ^ auVar213;
            }
            else {
              p_Var7 = context->args->filter;
              auVar213 = vpcmpeqd_avx(auVar106,auVar106);
              if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                auVar226 = ZEXT1664(auVar226._0_16_);
                (*p_Var7)(&args);
                auVar213 = vpcmpeqd_avx(auVar213,auVar213);
              }
              auVar67 = vpcmpeqd_avx(local_518,_DAT_01f45a50);
              auVar106 = auVar67 ^ auVar213;
              if (local_518 != (undefined1  [16])0x0) {
                auVar67 = auVar67 ^ auVar213;
                auVar213 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])args.hit);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar213;
                auVar213 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x10));
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar213;
                auVar213 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x20));
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar213;
                auVar213 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x30));
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar213;
                auVar213 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x40));
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar213;
                auVar213 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar213;
                auVar213 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar213;
                auVar213 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar213;
                auVar213 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar213;
              }
            }
            auVar79._8_8_ = 0x100000001;
            auVar79._0_8_ = 0x100000001;
            if ((auVar79 & auVar106) == (undefined1  [16])0x0) {
              *(float *)(ray + k * 4 + 0x80) = fVar262;
            }
          }
        }
      }
    }
    goto LAB_01185a47;
  }
  auVar106 = vinsertps_avx(auVar106,ZEXT416((uint)fVar87),0x10);
  auVar67 = vinsertps_avx(auVar138,ZEXT416((uint)auVar150._0_4_),0x10);
  goto LAB_01185497;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }